

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_h<embree::sse2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  int **ppiVar3;
  RTCRayQueryFlags *pRVar4;
  int **ppiVar5;
  RTCRayQueryFlags *pRVar6;
  Primitive *pPVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  Primitive PVar16;
  Geometry *pGVar17;
  __int_type_conflict _Var18;
  RTCFilterFunctionN p_Var19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined6 uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  int iVar59;
  undefined4 uVar60;
  ulong uVar61;
  long lVar62;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long extraout_RAX_02;
  long extraout_RAX_03;
  long extraout_RAX_04;
  long extraout_RAX_05;
  long extraout_RAX_06;
  RTCIntersectArguments *pRVar63;
  byte bVar64;
  ulong uVar65;
  RTCIntersectArguments *pRVar66;
  RTCIntersectArguments *pRVar67;
  int iVar68;
  undefined4 uVar69;
  long lVar70;
  RTCFilterFunctionNArguments *pRVar71;
  long lVar72;
  ulong uVar73;
  long lVar74;
  byte bVar75;
  ulong uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  short sVar81;
  undefined2 uVar123;
  float fVar82;
  float fVar83;
  undefined8 uVar84;
  float fVar125;
  __m128 a_1;
  float fVar124;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 extraout_var [12];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar126;
  float fVar151;
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar133 [16];
  float fVar152;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar153;
  float fVar171;
  float fVar172;
  vfloat4 v;
  float fVar173;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar174;
  float fVar193;
  float fVar194;
  vfloat4 v_1;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar195;
  float fVar210;
  float fVar211;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar212;
  float fVar234;
  float fVar235;
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  float fVar239;
  float fVar240;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar241;
  float fVar250;
  float fVar251;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar252;
  float fVar263;
  float fVar264;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar260 [16];
  undefined1 auVar262 [16];
  float fVar265;
  float fVar276;
  float fVar277;
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar278;
  float fVar285;
  float fVar286;
  undefined1 auVar279 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar287;
  float fVar294;
  float fVar296;
  float fVar298;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar292 [16];
  float fVar295;
  float fVar297;
  float fVar299;
  undefined1 auVar293 [16];
  float fVar300;
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar312;
  float fVar313;
  float fVar315;
  float fVar317;
  vfloat4 a;
  float fVar316;
  float fVar318;
  float fVar319;
  undefined1 auVar314 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloatx u_outer1;
  vfloatx u_outer0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  bool local_5e9;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  undefined4 local_5ac;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  undefined4 uStack_4ec;
  RTCIntersectArguments *local_4e0;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  undefined4 uStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  RTCFilterFunctionNArguments *local_4a0;
  RTCFilterFunctionNArguments local_498;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [12];
  float fStack_42c;
  undefined4 local_428;
  undefined4 local_424;
  undefined4 local_420;
  uint local_41c;
  uint local_418;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  ulong local_358;
  RayQueryContext *local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  float local_298 [4];
  Primitive *local_288;
  ulong local_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint local_f8 [4];
  float afStack_e8 [4];
  float local_d8 [42];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 uVar122;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar259 [16];
  undefined1 auVar261 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  
  PVar16 = prim[1];
  uVar61 = (ulong)(byte)PVar16;
  lVar62 = uVar61 * 0x25;
  pPVar7 = prim + lVar62 + 6;
  fVar172 = *(float *)(pPVar7 + 0xc);
  fVar174 = ((ray->org).field_0.m128[0] - *(float *)pPVar7) * fVar172;
  fVar193 = ((ray->org).field_0.m128[1] - *(float *)(pPVar7 + 4)) * fVar172;
  fVar194 = ((ray->org).field_0.m128[2] - *(float *)(pPVar7 + 8)) * fVar172;
  fVar153 = fVar172 * (ray->dir).field_0.m128[0];
  fVar171 = fVar172 * (ray->dir).field_0.m128[1];
  fVar172 = fVar172 * (ray->dir).field_0.m128[2];
  uVar69 = *(undefined4 *)(prim + uVar61 * 4 + 6);
  uVar122 = (undefined1)((uint)uVar69 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar69 >> 0x10);
  uVar84 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar69));
  uVar122 = (undefined1)((uint)uVar69 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar84 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar69,(char)uVar69);
  uVar65 = CONCAT62(uVar37,sVar81);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar65;
  auVar85._12_2_ = uVar123;
  auVar85._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar84 >> 0x20);
  auVar155._12_4_ = auVar85._12_4_;
  auVar155._8_2_ = 0;
  auVar155._0_8_ = uVar65;
  auVar155._10_2_ = uVar123;
  auVar270._10_6_ = auVar155._10_6_;
  auVar270._8_2_ = uVar123;
  auVar270._0_8_ = uVar65;
  uVar123 = (undefined2)uVar37;
  auVar38._4_8_ = auVar270._8_8_;
  auVar38._2_2_ = uVar123;
  auVar38._0_2_ = uVar123;
  fVar82 = (float)((int)sVar81 >> 8);
  fVar124 = (float)(auVar38._0_4_ >> 0x18);
  fVar125 = (float)(auVar270._8_4_ >> 0x18);
  uVar69 = *(undefined4 *)(prim + uVar61 * 5 + 6);
  uVar122 = (undefined1)((uint)uVar69 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar69 >> 0x10);
  uVar84 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar69));
  uVar122 = (undefined1)((uint)uVar69 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar84 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar69,(char)uVar69);
  uVar65 = CONCAT62(uVar37,sVar81);
  auVar129._8_4_ = 0;
  auVar129._0_8_ = uVar65;
  auVar129._12_2_ = uVar123;
  auVar129._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar84 >> 0x20);
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._8_2_ = 0;
  auVar128._0_8_ = uVar65;
  auVar128._10_2_ = uVar123;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._8_2_ = uVar123;
  auVar127._0_8_ = uVar65;
  uVar123 = (undefined2)uVar37;
  auVar39._4_8_ = auVar127._8_8_;
  auVar39._2_2_ = uVar123;
  auVar39._0_2_ = uVar123;
  fVar195 = (float)((int)sVar81 >> 8);
  fVar210 = (float)(auVar39._0_4_ >> 0x18);
  fVar211 = (float)(auVar127._8_4_ >> 0x18);
  uVar69 = *(undefined4 *)(prim + uVar61 * 6 + 6);
  uVar122 = (undefined1)((uint)uVar69 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar69 >> 0x10);
  uVar84 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar69));
  uVar122 = (undefined1)((uint)uVar69 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar84 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar69,(char)uVar69);
  uVar65 = CONCAT62(uVar37,sVar81);
  auVar132._8_4_ = 0;
  auVar132._0_8_ = uVar65;
  auVar132._12_2_ = uVar123;
  auVar132._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar84 >> 0x20);
  auVar131._12_4_ = auVar132._12_4_;
  auVar131._8_2_ = 0;
  auVar131._0_8_ = uVar65;
  auVar131._10_2_ = uVar123;
  auVar130._10_6_ = auVar131._10_6_;
  auVar130._8_2_ = uVar123;
  auVar130._0_8_ = uVar65;
  uVar123 = (undefined2)uVar37;
  auVar40._4_8_ = auVar130._8_8_;
  auVar40._2_2_ = uVar123;
  auVar40._0_2_ = uVar123;
  fVar252 = (float)((int)sVar81 >> 8);
  fVar263 = (float)(auVar40._0_4_ >> 0x18);
  fVar264 = (float)(auVar130._8_4_ >> 0x18);
  uVar69 = *(undefined4 *)(prim + uVar61 * 0xf + 6);
  uVar122 = (undefined1)((uint)uVar69 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar69 >> 0x10);
  uVar84 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar69));
  uVar122 = (undefined1)((uint)uVar69 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar84 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar69,(char)uVar69);
  uVar65 = CONCAT62(uVar37,sVar81);
  auVar135._8_4_ = 0;
  auVar135._0_8_ = uVar65;
  auVar135._12_2_ = uVar123;
  auVar135._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar84 >> 0x20);
  auVar134._12_4_ = auVar135._12_4_;
  auVar134._8_2_ = 0;
  auVar134._0_8_ = uVar65;
  auVar134._10_2_ = uVar123;
  auVar133._10_6_ = auVar134._10_6_;
  auVar133._8_2_ = uVar123;
  auVar133._0_8_ = uVar65;
  uVar123 = (undefined2)uVar37;
  auVar41._4_8_ = auVar133._8_8_;
  auVar41._2_2_ = uVar123;
  auVar41._0_2_ = uVar123;
  fVar83 = (float)((int)sVar81 >> 8);
  fStack_544 = (float)(auVar41._0_4_ >> 0x18);
  fStack_540 = (float)(auVar133._8_4_ >> 0x18);
  fStack_53c = (float)(auVar134._12_4_ >> 0x18);
  uVar69 = *(undefined4 *)(prim + (ulong)(byte)PVar16 * 0x10 + 6);
  uVar122 = (undefined1)((uint)uVar69 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar69 >> 0x10);
  uVar84 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar69));
  uVar122 = (undefined1)((uint)uVar69 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar84 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar69,(char)uVar69);
  uVar65 = CONCAT62(uVar37,sVar81);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar65;
  auVar215._12_2_ = uVar123;
  auVar215._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar84 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar65;
  auVar214._10_2_ = uVar123;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar123;
  auVar213._0_8_ = uVar65;
  uVar123 = (undefined2)uVar37;
  auVar42._4_8_ = auVar213._8_8_;
  auVar42._2_2_ = uVar123;
  auVar42._0_2_ = uVar123;
  fVar241 = (float)((int)sVar81 >> 8);
  fVar250 = (float)(auVar42._0_4_ >> 0x18);
  fVar251 = (float)(auVar213._8_4_ >> 0x18);
  uVar69 = *(undefined4 *)(prim + (ulong)(byte)PVar16 * 0x10 + uVar61 + 6);
  uVar122 = (undefined1)((uint)uVar69 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar69 >> 0x10);
  uVar84 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar69));
  uVar122 = (undefined1)((uint)uVar69 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar84 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar69,(char)uVar69);
  uVar65 = CONCAT62(uVar37,sVar81);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar65;
  auVar218._12_2_ = uVar123;
  auVar218._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar84 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar65;
  auVar217._10_2_ = uVar123;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar123;
  auVar216._0_8_ = uVar65;
  uVar123 = (undefined2)uVar37;
  auVar43._4_8_ = auVar216._8_8_;
  auVar43._2_2_ = uVar123;
  auVar43._0_2_ = uVar123;
  fVar265 = (float)((int)sVar81 >> 8);
  fVar276 = (float)(auVar43._0_4_ >> 0x18);
  fVar277 = (float)(auVar216._8_4_ >> 0x18);
  uVar69 = *(undefined4 *)(prim + uVar61 * 0x1a + 6);
  uVar122 = (undefined1)((uint)uVar69 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar69 >> 0x10);
  uVar84 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar69));
  uVar122 = (undefined1)((uint)uVar69 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar84 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar69,(char)uVar69);
  uVar65 = CONCAT62(uVar37,sVar81);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar65;
  auVar221._12_2_ = uVar123;
  auVar221._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar84 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar65;
  auVar220._10_2_ = uVar123;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar123;
  auVar219._0_8_ = uVar65;
  uVar123 = (undefined2)uVar37;
  auVar44._4_8_ = auVar219._8_8_;
  auVar44._2_2_ = uVar123;
  auVar44._0_2_ = uVar123;
  fVar312 = (float)((int)sVar81 >> 8);
  fVar315 = (float)(auVar44._0_4_ >> 0x18);
  fVar317 = (float)(auVar219._8_4_ >> 0x18);
  uVar69 = *(undefined4 *)(prim + uVar61 * 0x1b + 6);
  uVar122 = (undefined1)((uint)uVar69 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar69 >> 0x10);
  uVar84 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar69));
  uVar122 = (undefined1)((uint)uVar69 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar84 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar69,(char)uVar69);
  uVar65 = CONCAT62(uVar37,sVar81);
  auVar224._8_4_ = 0;
  auVar224._0_8_ = uVar65;
  auVar224._12_2_ = uVar123;
  auVar224._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar84 >> 0x20);
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._8_2_ = 0;
  auVar223._0_8_ = uVar65;
  auVar223._10_2_ = uVar123;
  auVar222._10_6_ = auVar223._10_6_;
  auVar222._8_2_ = uVar123;
  auVar222._0_8_ = uVar65;
  uVar123 = (undefined2)uVar37;
  auVar45._4_8_ = auVar222._8_8_;
  auVar45._2_2_ = uVar123;
  auVar45._0_2_ = uVar123;
  fVar278 = (float)((int)sVar81 >> 8);
  fVar285 = (float)(auVar45._0_4_ >> 0x18);
  fVar286 = (float)(auVar222._8_4_ >> 0x18);
  uVar69 = *(undefined4 *)(prim + uVar61 * 0x1c + 6);
  uVar122 = (undefined1)((uint)uVar69 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar69 >> 0x10);
  uVar84 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar69));
  uVar122 = (undefined1)((uint)uVar69 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar84 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar69,(char)uVar69);
  uVar65 = CONCAT62(uVar37,sVar81);
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar65;
  auVar227._12_2_ = uVar123;
  auVar227._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar84 >> 0x20);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar65;
  auVar226._10_2_ = uVar123;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = uVar123;
  auVar225._0_8_ = uVar65;
  uVar123 = (undefined2)uVar37;
  auVar46._4_8_ = auVar225._8_8_;
  auVar46._2_2_ = uVar123;
  auVar46._0_2_ = uVar123;
  fVar236 = (float)((int)sVar81 >> 8);
  fVar239 = (float)(auVar46._0_4_ >> 0x18);
  fVar240 = (float)(auVar225._8_4_ >> 0x18);
  fVar300 = fVar153 * fVar82 + fVar171 * fVar195 + fVar172 * fVar252;
  fVar309 = fVar153 * fVar124 + fVar171 * fVar210 + fVar172 * fVar263;
  fVar310 = fVar153 * fVar125 + fVar171 * fVar211 + fVar172 * fVar264;
  fVar311 = fVar153 * (float)(auVar155._12_4_ >> 0x18) +
            fVar171 * (float)(auVar128._12_4_ >> 0x18) + fVar172 * (float)(auVar131._12_4_ >> 0x18);
  fVar287 = fVar153 * fVar83 + fVar171 * fVar241 + fVar172 * fVar265;
  fVar294 = fVar153 * fStack_544 + fVar171 * fVar250 + fVar172 * fVar276;
  fVar296 = fVar153 * fStack_540 + fVar171 * fVar251 + fVar172 * fVar277;
  fVar298 = fVar153 * fStack_53c +
            fVar171 * (float)(auVar214._12_4_ >> 0x18) + fVar172 * (float)(auVar217._12_4_ >> 0x18);
  fVar212 = fVar153 * fVar312 + fVar171 * fVar278 + fVar172 * fVar236;
  fVar234 = fVar153 * fVar315 + fVar171 * fVar285 + fVar172 * fVar239;
  fVar235 = fVar153 * fVar317 + fVar171 * fVar286 + fVar172 * fVar240;
  fVar153 = fVar153 * (float)(auVar220._12_4_ >> 0x18) +
            fVar171 * (float)(auVar223._12_4_ >> 0x18) + fVar172 * (float)(auVar226._12_4_ >> 0x18);
  fVar126 = fVar82 * fVar174 + fVar195 * fVar193 + fVar252 * fVar194;
  fVar151 = fVar124 * fVar174 + fVar210 * fVar193 + fVar263 * fVar194;
  fVar264 = fVar125 * fVar174 + fVar211 * fVar193 + fVar264 * fVar194;
  fVar152 = (float)(auVar155._12_4_ >> 0x18) * fVar174 +
            (float)(auVar128._12_4_ >> 0x18) * fVar193 + (float)(auVar131._12_4_ >> 0x18) * fVar194;
  fVar265 = fVar83 * fVar174 + fVar241 * fVar193 + fVar265 * fVar194;
  fVar276 = fStack_544 * fVar174 + fVar250 * fVar193 + fVar276 * fVar194;
  fVar277 = fStack_540 * fVar174 + fVar251 * fVar193 + fVar277 * fVar194;
  fVar173 = fStack_53c * fVar174 +
            (float)(auVar214._12_4_ >> 0x18) * fVar193 + (float)(auVar217._12_4_ >> 0x18) * fVar194;
  fVar312 = fVar174 * fVar312 + fVar193 * fVar278 + fVar194 * fVar236;
  fVar285 = fVar174 * fVar315 + fVar193 * fVar285 + fVar194 * fVar239;
  fVar286 = fVar174 * fVar317 + fVar193 * fVar286 + fVar194 * fVar240;
  fVar315 = fVar174 * (float)(auVar220._12_4_ >> 0x18) +
            fVar193 * (float)(auVar223._12_4_ >> 0x18) + fVar194 * (float)(auVar226._12_4_ >> 0x18);
  fVar172 = (float)DAT_01ff1d40;
  fVar82 = DAT_01ff1d40._4_4_;
  fVar83 = DAT_01ff1d40._8_4_;
  fVar124 = DAT_01ff1d40._12_4_;
  uVar77 = -(uint)(fVar172 <= ABS(fVar300));
  uVar78 = -(uint)(fVar82 <= ABS(fVar309));
  uVar79 = -(uint)(fVar83 <= ABS(fVar310));
  uVar80 = -(uint)(fVar124 <= ABS(fVar311));
  auVar301._0_4_ = (uint)fVar300 & uVar77;
  auVar301._4_4_ = (uint)fVar309 & uVar78;
  auVar301._8_4_ = (uint)fVar310 & uVar79;
  auVar301._12_4_ = (uint)fVar311 & uVar80;
  auVar175._0_4_ = ~uVar77 & (uint)fVar172;
  auVar175._4_4_ = ~uVar78 & (uint)fVar82;
  auVar175._8_4_ = ~uVar79 & (uint)fVar83;
  auVar175._12_4_ = ~uVar80 & (uint)fVar124;
  auVar175 = auVar175 | auVar301;
  uVar77 = -(uint)(fVar172 <= ABS(fVar287));
  uVar78 = -(uint)(fVar82 <= ABS(fVar294));
  uVar79 = -(uint)(fVar83 <= ABS(fVar296));
  uVar80 = -(uint)(fVar124 <= ABS(fVar298));
  auVar288._0_4_ = (uint)fVar287 & uVar77;
  auVar288._4_4_ = (uint)fVar294 & uVar78;
  auVar288._8_4_ = (uint)fVar296 & uVar79;
  auVar288._12_4_ = (uint)fVar298 & uVar80;
  auVar237._0_4_ = ~uVar77 & (uint)fVar172;
  auVar237._4_4_ = ~uVar78 & (uint)fVar82;
  auVar237._8_4_ = ~uVar79 & (uint)fVar83;
  auVar237._12_4_ = ~uVar80 & (uint)fVar124;
  auVar237 = auVar237 | auVar288;
  uVar77 = -(uint)(fVar172 <= ABS(fVar212));
  uVar78 = -(uint)(fVar82 <= ABS(fVar234));
  uVar79 = -(uint)(fVar83 <= ABS(fVar235));
  uVar80 = -(uint)(fVar124 <= ABS(fVar153));
  auVar228._0_4_ = (uint)fVar212 & uVar77;
  auVar228._4_4_ = (uint)fVar234 & uVar78;
  auVar228._8_4_ = (uint)fVar235 & uVar79;
  auVar228._12_4_ = (uint)fVar153 & uVar80;
  auVar242._0_4_ = ~uVar77 & (uint)fVar172;
  auVar242._4_4_ = ~uVar78 & (uint)fVar82;
  auVar242._8_4_ = ~uVar79 & (uint)fVar83;
  auVar242._12_4_ = ~uVar80 & (uint)fVar124;
  auVar242 = auVar242 | auVar228;
  auVar85 = rcpps(_DAT_01ff1d40,auVar175);
  fVar172 = auVar85._0_4_;
  fVar124 = auVar85._4_4_;
  fVar211 = auVar85._8_4_;
  fVar251 = auVar85._12_4_;
  fVar172 = (1.0 - auVar175._0_4_ * fVar172) * fVar172 + fVar172;
  fVar124 = (1.0 - auVar175._4_4_ * fVar124) * fVar124 + fVar124;
  fVar211 = (1.0 - auVar175._8_4_ * fVar211) * fVar211 + fVar211;
  fVar251 = (1.0 - auVar175._12_4_ * fVar251) * fVar251 + fVar251;
  auVar85 = rcpps(auVar85,auVar237);
  fVar82 = auVar85._0_4_;
  fVar125 = auVar85._4_4_;
  fVar212 = auVar85._8_4_;
  fVar252 = auVar85._12_4_;
  fVar82 = (1.0 - auVar237._0_4_ * fVar82) * fVar82 + fVar82;
  fVar125 = (1.0 - auVar237._4_4_ * fVar125) * fVar125 + fVar125;
  fVar212 = (1.0 - auVar237._8_4_ * fVar212) * fVar212 + fVar212;
  fVar252 = (1.0 - auVar237._12_4_ * fVar252) * fVar252 + fVar252;
  auVar85 = rcpps(auVar85,auVar242);
  fVar83 = auVar85._0_4_;
  fVar153 = auVar85._4_4_;
  fVar234 = auVar85._8_4_;
  fVar263 = auVar85._12_4_;
  fVar83 = (1.0 - auVar242._0_4_ * fVar83) * fVar83 + fVar83;
  fVar153 = (1.0 - auVar242._4_4_ * fVar153) * fVar153 + fVar153;
  fVar234 = (1.0 - auVar242._8_4_ * fVar234) * fVar234 + fVar234;
  fVar263 = (1.0 - auVar242._12_4_ * fVar263) * fVar263 + fVar263;
  fVar278 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar62 + 0x16)) *
            *(float *)(prim + lVar62 + 0x1a);
  uVar65 = *(ulong *)(prim + uVar61 * 7 + 6);
  uVar123 = (undefined2)(uVar65 >> 0x30);
  auVar322._8_4_ = 0;
  auVar322._0_8_ = uVar65;
  auVar322._12_2_ = uVar123;
  auVar322._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar65 >> 0x20);
  auVar87._12_4_ = auVar322._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar65;
  auVar87._10_2_ = uVar123;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar123;
  auVar86._0_8_ = uVar65;
  uVar123 = (undefined2)(uVar65 >> 0x10);
  auVar47._4_8_ = auVar86._8_8_;
  auVar47._2_2_ = uVar123;
  auVar47._0_2_ = uVar123;
  fVar171 = (float)(auVar47._0_4_ >> 0x10);
  fVar235 = (float)(auVar86._8_4_ >> 0x10);
  uVar76 = *(ulong *)(prim + uVar61 * 0xb + 6);
  uVar123 = (undefined2)(uVar76 >> 0x30);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar76;
  auVar178._12_2_ = uVar123;
  auVar178._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar76 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar76;
  auVar177._10_2_ = uVar123;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar123;
  auVar176._0_8_ = uVar76;
  uVar123 = (undefined2)(uVar76 >> 0x10);
  auVar48._4_8_ = auVar176._8_8_;
  auVar48._2_2_ = uVar123;
  auVar48._0_2_ = uVar123;
  uVar8 = *(ulong *)(prim + uVar61 * 9 + 6);
  uVar123 = (undefined2)(uVar8 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar8;
  auVar90._12_2_ = uVar123;
  auVar90._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar8 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar8;
  auVar89._10_2_ = uVar123;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar123;
  auVar88._0_8_ = uVar8;
  uVar123 = (undefined2)(uVar8 >> 0x10);
  auVar49._4_8_ = auVar88._8_8_;
  auVar49._2_2_ = uVar123;
  auVar49._0_2_ = uVar123;
  fVar174 = (float)(auVar49._0_4_ >> 0x10);
  fVar236 = (float)(auVar88._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar61 * 0xd + 6);
  uVar123 = (undefined2)(uVar9 >> 0x30);
  auVar245._8_4_ = 0;
  auVar245._0_8_ = uVar9;
  auVar245._12_2_ = uVar123;
  auVar245._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar9 >> 0x20);
  auVar244._12_4_ = auVar245._12_4_;
  auVar244._8_2_ = 0;
  auVar244._0_8_ = uVar9;
  auVar244._10_2_ = uVar123;
  auVar243._10_6_ = auVar244._10_6_;
  auVar243._8_2_ = uVar123;
  auVar243._0_8_ = uVar9;
  uVar123 = (undefined2)(uVar9 >> 0x10);
  auVar50._4_8_ = auVar243._8_8_;
  auVar50._2_2_ = uVar123;
  auVar50._0_2_ = uVar123;
  uVar10 = *(ulong *)(prim + uVar61 * 0x12 + 6);
  uVar123 = (undefined2)(uVar10 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar10;
  auVar93._12_2_ = uVar123;
  auVar93._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar10 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar10;
  auVar92._10_2_ = uVar123;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar123;
  auVar91._0_8_ = uVar10;
  uVar123 = (undefined2)(uVar10 >> 0x10);
  auVar51._4_8_ = auVar91._8_8_;
  auVar51._2_2_ = uVar123;
  auVar51._0_2_ = uVar123;
  fVar193 = (float)(auVar51._0_4_ >> 0x10);
  fVar239 = (float)(auVar91._8_4_ >> 0x10);
  uVar73 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  uVar11 = *(ulong *)(prim + uVar61 * 2 + uVar73 + 6);
  uVar123 = (undefined2)(uVar11 >> 0x30);
  auVar268._8_4_ = 0;
  auVar268._0_8_ = uVar11;
  auVar268._12_2_ = uVar123;
  auVar268._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar11 >> 0x20);
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._8_2_ = 0;
  auVar267._0_8_ = uVar11;
  auVar267._10_2_ = uVar123;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._8_2_ = uVar123;
  auVar266._0_8_ = uVar11;
  uVar123 = (undefined2)(uVar11 >> 0x10);
  auVar52._4_8_ = auVar266._8_8_;
  auVar52._2_2_ = uVar123;
  auVar52._0_2_ = uVar123;
  uVar73 = *(ulong *)(prim + uVar73 + 6);
  uVar123 = (undefined2)(uVar73 >> 0x30);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar73;
  auVar96._12_2_ = uVar123;
  auVar96._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar73 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar73;
  auVar95._10_2_ = uVar123;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar123;
  auVar94._0_8_ = uVar73;
  uVar123 = (undefined2)(uVar73 >> 0x10);
  auVar53._4_8_ = auVar94._8_8_;
  auVar53._2_2_ = uVar123;
  auVar53._0_2_ = uVar123;
  fVar194 = (float)(auVar53._0_4_ >> 0x10);
  fVar240 = (float)(auVar94._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar61 * 0x18 + 6);
  uVar123 = (undefined2)(uVar12 >> 0x30);
  auVar281._8_4_ = 0;
  auVar281._0_8_ = uVar12;
  auVar281._12_2_ = uVar123;
  auVar281._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar12 >> 0x20);
  auVar280._12_4_ = auVar281._12_4_;
  auVar280._8_2_ = 0;
  auVar280._0_8_ = uVar12;
  auVar280._10_2_ = uVar123;
  auVar279._10_6_ = auVar280._10_6_;
  auVar279._8_2_ = uVar123;
  auVar279._0_8_ = uVar12;
  uVar123 = (undefined2)(uVar12 >> 0x10);
  auVar54._4_8_ = auVar279._8_8_;
  auVar54._2_2_ = uVar123;
  auVar54._0_2_ = uVar123;
  uVar13 = *(ulong *)(prim + uVar61 * 0x1d + 6);
  uVar123 = (undefined2)(uVar13 >> 0x30);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar13;
  auVar99._12_2_ = uVar123;
  auVar99._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar13 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar13;
  auVar98._10_2_ = uVar123;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar123;
  auVar97._0_8_ = uVar13;
  uVar123 = (undefined2)(uVar13 >> 0x10);
  auVar55._4_8_ = auVar97._8_8_;
  auVar55._2_2_ = uVar123;
  auVar55._0_2_ = uVar123;
  fVar195 = (float)(auVar55._0_4_ >> 0x10);
  fVar241 = (float)(auVar97._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar61 + (ulong)(byte)PVar16 * 0x20 + 6);
  uVar123 = (undefined2)(uVar14 >> 0x30);
  auVar291._8_4_ = 0;
  auVar291._0_8_ = uVar14;
  auVar291._12_2_ = uVar123;
  auVar291._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar14 >> 0x20);
  auVar290._12_4_ = auVar291._12_4_;
  auVar290._8_2_ = 0;
  auVar290._0_8_ = uVar14;
  auVar290._10_2_ = uVar123;
  auVar289._10_6_ = auVar290._10_6_;
  auVar289._8_2_ = uVar123;
  auVar289._0_8_ = uVar14;
  uVar123 = (undefined2)(uVar14 >> 0x10);
  auVar56._4_8_ = auVar289._8_8_;
  auVar56._2_2_ = uVar123;
  auVar56._0_2_ = uVar123;
  uVar15 = *(ulong *)(prim + ((ulong)(byte)PVar16 * 0x20 - uVar61) + 6);
  uVar123 = (undefined2)(uVar15 >> 0x30);
  auVar102._8_4_ = 0;
  auVar102._0_8_ = uVar15;
  auVar102._12_2_ = uVar123;
  auVar102._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar15 >> 0x20);
  auVar101._12_4_ = auVar102._12_4_;
  auVar101._8_2_ = 0;
  auVar101._0_8_ = uVar15;
  auVar101._10_2_ = uVar123;
  auVar100._10_6_ = auVar101._10_6_;
  auVar100._8_2_ = uVar123;
  auVar100._0_8_ = uVar15;
  uVar123 = (undefined2)(uVar15 >> 0x10);
  auVar57._4_8_ = auVar100._8_8_;
  auVar57._2_2_ = uVar123;
  auVar57._0_2_ = uVar123;
  fVar210 = (float)(auVar57._0_4_ >> 0x10);
  fVar250 = (float)(auVar100._8_4_ >> 0x10);
  uVar61 = *(ulong *)(prim + uVar61 * 0x23 + 6);
  uVar123 = (undefined2)(uVar61 >> 0x30);
  auVar304._8_4_ = 0;
  auVar304._0_8_ = uVar61;
  auVar304._12_2_ = uVar123;
  auVar304._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar61 >> 0x20);
  auVar303._12_4_ = auVar304._12_4_;
  auVar303._8_2_ = 0;
  auVar303._0_8_ = uVar61;
  auVar303._10_2_ = uVar123;
  auVar302._10_6_ = auVar303._10_6_;
  auVar302._8_2_ = uVar123;
  auVar302._0_8_ = uVar61;
  uVar123 = (undefined2)(uVar61 >> 0x10);
  auVar58._4_8_ = auVar302._8_8_;
  auVar58._2_2_ = uVar123;
  auVar58._0_2_ = uVar123;
  auVar179._0_8_ =
       CONCAT44(((((float)(auVar48._0_4_ >> 0x10) - fVar171) * fVar278 + fVar171) - fVar151) *
                fVar124,((((float)(int)(short)uVar76 - (float)(int)(short)uVar65) * fVar278 +
                         (float)(int)(short)uVar65) - fVar126) * fVar172);
  auVar179._8_4_ =
       ((((float)(auVar176._8_4_ >> 0x10) - fVar235) * fVar278 + fVar235) - fVar264) * fVar211;
  auVar179._12_4_ =
       ((((float)(auVar177._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar152) * fVar251;
  auVar246._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar8) * fVar278 + (float)(int)(short)uVar8)
       - fVar126) * fVar172;
  auVar246._4_4_ =
       ((((float)(auVar50._0_4_ >> 0x10) - fVar174) * fVar278 + fVar174) - fVar151) * fVar124;
  auVar246._8_4_ =
       ((((float)(auVar243._8_4_ >> 0x10) - fVar236) * fVar278 + fVar236) - fVar264) * fVar211;
  auVar246._12_4_ =
       ((((float)(auVar244._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar152) * fVar251;
  auVar269._0_8_ =
       CONCAT44(((((float)(auVar52._0_4_ >> 0x10) - fVar193) * fVar278 + fVar193) - fVar276) *
                fVar125,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar278 +
                         (float)(int)(short)uVar10) - fVar265) * fVar82);
  auVar269._8_4_ =
       ((((float)(auVar266._8_4_ >> 0x10) - fVar239) * fVar278 + fVar239) - fVar277) * fVar212;
  auVar269._12_4_ =
       ((((float)(auVar267._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar173) * fVar252;
  auVar282._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar73) * fVar278 +
        (float)(int)(short)uVar73) - fVar265) * fVar82;
  auVar282._4_4_ =
       ((((float)(auVar54._0_4_ >> 0x10) - fVar194) * fVar278 + fVar194) - fVar276) * fVar125;
  auVar282._8_4_ =
       ((((float)(auVar279._8_4_ >> 0x10) - fVar240) * fVar278 + fVar240) - fVar277) * fVar212;
  auVar282._12_4_ =
       ((((float)(auVar280._12_4_ >> 0x10) - (float)(auVar95._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar95._12_4_ >> 0x10)) - fVar173) * fVar252;
  auVar292._0_8_ =
       CONCAT44(((((float)(auVar56._0_4_ >> 0x10) - fVar195) * fVar278 + fVar195) - fVar285) *
                fVar153,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar278 +
                         (float)(int)(short)uVar13) - fVar312) * fVar83);
  auVar292._8_4_ =
       ((((float)(auVar289._8_4_ >> 0x10) - fVar241) * fVar278 + fVar241) - fVar286) * fVar234;
  auVar292._12_4_ =
       ((((float)(auVar290._12_4_ >> 0x10) - (float)(auVar98._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar98._12_4_ >> 0x10)) - fVar315) * fVar263;
  auVar305._0_4_ =
       ((((float)(int)(short)uVar61 - (float)(int)(short)uVar15) * fVar278 +
        (float)(int)(short)uVar15) - fVar312) * fVar83;
  auVar305._4_4_ =
       ((((float)(auVar58._0_4_ >> 0x10) - fVar210) * fVar278 + fVar210) - fVar285) * fVar153;
  auVar305._8_4_ =
       ((((float)(auVar302._8_4_ >> 0x10) - fVar250) * fVar278 + fVar250) - fVar286) * fVar234;
  auVar305._12_4_ =
       ((((float)(auVar303._12_4_ >> 0x10) - (float)(auVar101._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar101._12_4_ >> 0x10)) - fVar315) * fVar263;
  auVar154._8_4_ = auVar179._8_4_;
  auVar154._0_8_ = auVar179._0_8_;
  auVar154._12_4_ = auVar179._12_4_;
  auVar155 = minps(auVar154,auVar246);
  auVar103._8_4_ = auVar269._8_4_;
  auVar103._0_8_ = auVar269._0_8_;
  auVar103._12_4_ = auVar269._12_4_;
  auVar85 = minps(auVar103,auVar282);
  auVar155 = maxps(auVar155,auVar85);
  auVar104._8_4_ = auVar292._8_4_;
  auVar104._0_8_ = auVar292._0_8_;
  auVar104._12_4_ = auVar292._12_4_;
  auVar85 = minps(auVar104,auVar305);
  uVar69 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar136._4_4_ = uVar69;
  auVar136._0_4_ = uVar69;
  auVar136._8_4_ = uVar69;
  auVar136._12_4_ = uVar69;
  auVar85 = maxps(auVar85,auVar136);
  auVar85 = maxps(auVar155,auVar85);
  auVar155 = maxps(auVar179,auVar246);
  auVar270 = maxps(auVar269,auVar282);
  auVar155 = minps(auVar155,auVar270);
  auVar270 = maxps(auVar292,auVar305);
  fVar172 = ray->tfar;
  auVar105._4_4_ = fVar172;
  auVar105._0_4_ = fVar172;
  auVar105._8_4_ = fVar172;
  auVar105._12_4_ = fVar172;
  auVar270 = minps(auVar270,auVar105);
  local_228 = auVar85._0_4_ * 0.99999964;
  fStack_224 = auVar85._4_4_ * 0.99999964;
  fStack_220 = auVar85._8_4_ * 0.99999964;
  fStack_21c = auVar85._12_4_ * 0.99999964;
  auVar85 = minps(auVar155,auVar270);
  uVar77 = (uint)(byte)PVar16;
  auVar106._0_4_ = -(uint)(local_228 <= auVar85._0_4_ * 1.0000004 && uVar77 != 0);
  auVar106._4_4_ = -(uint)(fStack_224 <= auVar85._4_4_ * 1.0000004 && 1 < uVar77);
  auVar106._8_4_ = -(uint)(fStack_220 <= auVar85._8_4_ * 1.0000004 && 2 < uVar77);
  auVar106._12_4_ = -(uint)(fStack_21c <= auVar85._12_4_ * 1.0000004 && 3 < uVar77);
  uVar77 = movmskps(uVar77,auVar106);
  local_5e9 = uVar77 != 0;
  if (uVar77 == 0) {
    return local_5e9;
  }
  uVar77 = uVar77 & 0xff;
  local_198._0_12_ = mm_lookupmask_ps._240_12_;
  local_198._12_4_ = 0;
  local_350 = context;
  local_288 = prim;
LAB_00bfcbc3:
  local_280 = (ulong)uVar77;
  lVar62 = 0;
  if (local_280 != 0) {
    for (; (uVar77 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
    }
  }
  local_4e0 = (RTCIntersectArguments *)(ulong)*(uint *)(local_288 + 2);
  local_358 = (ulong)*(uint *)(local_288 + lVar62 * 4 + 6);
  pGVar17 = (context->scene->geometries).items[(long)local_4e0].ptr;
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                           local_358 *
                           pGVar17[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_548 = pGVar17->fnumTimeSegments;
  fVar172 = (pGVar17->time_range).lower;
  fVar172 = (((ray->dir).field_0.m128[3] - fVar172) / ((pGVar17->time_range).upper - fVar172)) *
            local_548;
  _local_538 = ZEXT416((uint)fVar172);
  fVar172 = floorf(fVar172);
  if (local_548 + -1.0 <= fVar172) {
    fVar172 = local_548 + -1.0;
  }
  fVar82 = 0.0;
  if (0.0 <= fVar172) {
    fVar82 = fVar172;
  }
  fVar153 = (float)local_538._0_4_ - fVar82;
  fVar125 = 1.0 - fVar153;
  _Var18 = pGVar17[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar72 = (long)(int)fVar82 * 0x38;
  lVar62 = *(long *)(_Var18 + 0x10 + lVar72);
  uVar76 = uVar65 + 1;
  p_Var19 = pGVar17[4].occlusionFilterN;
  pRVar63 = *(RTCIntersectArguments **)(p_Var19 + lVar72);
  lVar70 = *(long *)(p_Var19 + lVar72 + 0x10) * uVar76;
  lVar74 = *(long *)(_Var18 + 0x38 + lVar72);
  lVar20 = *(long *)(_Var18 + 0x48 + lVar72);
  pRVar71 = *(RTCFilterFunctionNArguments **)(p_Var19 + lVar72 + 0x38);
  pfVar1 = (float *)(lVar74 + lVar20 * uVar65);
  pfVar2 = (float *)(*(long *)(_Var18 + lVar72) + lVar62 * uVar65);
  local_538._0_4_ = *pfVar2 * fVar125 + *pfVar1 * fVar153;
  local_538._4_4_ = pfVar2[1] * fVar125 + pfVar1[1] * fVar153;
  fStack_530 = pfVar2[2] * fVar125 + pfVar1[2] * fVar153;
  fVar174 = pfVar2[3] * fVar125 + pfVar1[3] * fVar153;
  ppiVar3 = (int **)((long)&pRVar71->valid + uVar65 * *(long *)(p_Var19 + lVar72 + 0x48));
  pRVar4 = (RTCRayQueryFlags *)((long)&pRVar63->flags + *(long *)(p_Var19 + lVar72 + 0x10) * uVar65)
  ;
  pfVar1 = (float *)(lVar74 + lVar20 * uVar76);
  pfVar2 = (float *)(*(long *)(_Var18 + lVar72) + lVar62 * uVar76);
  local_448 = *pfVar2 * fVar125 + *pfVar1 * fVar153;
  fStack_444 = pfVar2[1] * fVar125 + pfVar1[1] * fVar153;
  fStack_440 = pfVar2[2] * fVar125 + pfVar1[2] * fVar153;
  fStack_43c = pfVar2[3] * fVar125 + pfVar1[3] * fVar153;
  ppiVar5 = (int **)((long)&pRVar71->valid + *(long *)(p_Var19 + lVar72 + 0x48) * uVar76);
  pRVar6 = (RTCRayQueryFlags *)((long)&pRVar63->flags + lVar70);
  local_548 = ((float)*pRVar4 * fVar125 + *(float *)ppiVar3 * fVar153) * 0.33333334 +
              (float)local_538._0_4_;
  fStack_544 = ((float)pRVar4[1] * fVar125 + *(float *)((long)ppiVar3 + 4) * fVar153) * 0.33333334 +
               (float)local_538._4_4_;
  local_588 = ((float)pRVar4[2] * fVar125 + *(float *)(ppiVar3 + 1) * fVar153) * 0.33333334 +
              fStack_530;
  local_458 = local_448 - (fVar125 * (float)*pRVar6 + fVar153 * *(float *)ppiVar5) * 0.33333334;
  fStack_454 = fStack_444 -
               (fVar125 * (float)pRVar6[1] + fVar153 * *(float *)((long)ppiVar5 + 4)) * 0.33333334;
  fStack_450 = fStack_440 -
               (fVar125 * (float)pRVar6[2] + fVar153 * *(float *)(ppiVar5 + 1)) * 0.33333334;
  fVar172 = (ray->org).field_0.m128[0];
  fVar82 = (ray->org).field_0.m128[1];
  fVar83 = (ray->org).field_0.m128[2];
  local_2d8 = (ray->dir).field_0.m128[0];
  local_348 = (ray->dir).field_0.m128[1];
  local_3e8 = (ray->dir).field_0.m128[2];
  fVar124 = (ray->dir).field_0.m128[3];
  fStack_11c = local_2d8 * local_2d8;
  fVar193 = local_348 * local_348;
  fVar194 = local_3e8 * local_3e8;
  fVar124 = fVar124 * fVar124;
  fVar171 = fStack_11c + fVar193 + fVar194;
  auVar196._0_8_ = CONCAT44(fVar193 + fVar193 + fVar124,fVar171);
  auVar196._8_4_ = fVar194 + fVar193 + fVar194;
  auVar196._12_4_ = fVar124 + fVar193 + fVar124;
  auVar180._8_4_ = auVar196._8_4_;
  auVar180._0_8_ = auVar196._0_8_;
  auVar180._12_4_ = auVar196._12_4_;
  auVar85 = rcpss(auVar180,auVar196);
  local_528 = (2.0 - fVar171 * auVar85._0_4_) * auVar85._0_4_ *
              (((fStack_530 + local_588 + fStack_450 + fStack_440) * 0.25 - fVar83) * local_3e8 +
              (((float)local_538._4_4_ + fStack_544 + fStack_454 + fStack_444) * 0.25 - fVar82) *
              local_348 +
              (((float)local_538._0_4_ + local_548 + local_458 + local_448) * 0.25 - fVar172) *
              local_2d8);
  local_2b8 = ZEXT416((uint)local_528);
  fVar172 = local_2d8 * local_528 + fVar172;
  fVar82 = local_348 * local_528 + fVar82;
  fVar83 = local_3e8 * local_528 + fVar83;
  local_538._0_4_ = (float)local_538._0_4_ - fVar172;
  local_538._4_4_ = (float)local_538._4_4_ - fVar82;
  fStack_530 = fStack_530 - fVar83;
  fStack_52c = fVar174 - 0.0;
  local_458 = local_458 - fVar172;
  fStack_454 = fStack_454 - fVar82;
  fStack_450 = fStack_450 - fVar83;
  fStack_44c = (fStack_43c -
               (fVar125 * (float)pRVar6[3] + fVar153 * *(float *)((long)ppiVar5 + 0xc)) * 0.33333334
               ) - 0.0;
  local_548 = local_548 - fVar172;
  fStack_544 = fStack_544 - fVar82;
  local_588 = local_588 - fVar83;
  local_598 = (((float)pRVar4[3] * fVar125 + *(float *)((long)ppiVar3 + 0xc) * fVar153) * 0.33333334
              + fVar174) - 0.0;
  local_448 = local_448 - fVar172;
  fStack_444 = fStack_444 - fVar82;
  fStack_440 = fStack_440 - fVar83;
  fStack_43c = fStack_43c - 0.0;
  local_128 = fStack_11c + fVar194 + fVar193;
  fStack_124 = fStack_11c + fVar194 + fVar193;
  fStack_120 = fStack_11c + fVar194 + fVar193;
  fStack_11c = fStack_11c + fVar194 + fVar193;
  local_138 = local_458;
  fStack_134 = local_458;
  fStack_130 = local_458;
  fStack_12c = local_458;
  local_148 = fStack_454;
  fStack_144 = fStack_454;
  fStack_140 = fStack_454;
  fStack_13c = fStack_454;
  local_258 = fStack_44c;
  fStack_254 = fStack_44c;
  fStack_250 = fStack_44c;
  fStack_24c = fStack_44c;
  local_158 = local_448;
  fStack_154 = local_448;
  fStack_150 = local_448;
  fStack_14c = local_448;
  local_168 = fStack_444;
  fStack_164 = fStack_444;
  fStack_160 = fStack_444;
  fStack_15c = fStack_444;
  local_178 = fStack_440;
  fStack_174 = fStack_440;
  fStack_170 = fStack_440;
  fStack_16c = fStack_440;
  local_188 = fStack_43c;
  fStack_184 = fStack_43c;
  fStack_180 = fStack_43c;
  fStack_17c = fStack_43c;
  fStack_2d4 = local_2d8;
  fStack_2d0 = local_2d8;
  fStack_2cc = local_2d8;
  fStack_344 = local_348;
  fStack_340 = local_348;
  fStack_33c = local_348;
  fStack_3e4 = local_3e8;
  fStack_3e0 = local_3e8;
  fStack_3dc = local_3e8;
  local_268 = ABS(local_128);
  fStack_264 = ABS(fStack_124);
  fStack_260 = ABS(fStack_120);
  fStack_25c = ABS(fStack_11c);
  lVar62 = 1;
  local_4a0 = (RTCFilterFunctionNArguments *)0x1;
  pRVar66 = (RTCIntersectArguments *)0x0;
  bVar64 = 0;
  local_2c8._0_4_ = 0.0;
  local_2c8._4_4_ = 1.0;
  uStack_2c0._0_4_ = 0;
  uStack_2c0._4_4_ = 0;
  local_1b8 = (float)local_538._0_4_;
  fStack_1b4 = (float)local_538._0_4_;
  fStack_1b0 = (float)local_538._0_4_;
  fStack_1ac = (float)local_538._0_4_;
  local_1c8 = (float)local_538._4_4_;
  fStack_1c4 = (float)local_538._4_4_;
  fStack_1c0 = (float)local_538._4_4_;
  fStack_1bc = (float)local_538._4_4_;
  local_1d8 = fStack_530;
  fStack_1d4 = fStack_530;
  fStack_1d0 = fStack_530;
  fStack_1cc = fStack_530;
  local_1e8 = fStack_52c;
  fStack_1e4 = fStack_52c;
  fStack_1e0 = fStack_52c;
  fStack_1dc = fStack_52c;
  local_1f8 = local_548;
  fStack_1f4 = local_548;
  fStack_1f0 = local_548;
  fStack_1ec = local_548;
  local_208 = fStack_544;
  fStack_204 = fStack_544;
  fStack_200 = fStack_544;
  fStack_1fc = fStack_544;
  local_218 = fStack_450;
  fStack_214 = fStack_450;
  fStack_210 = fStack_450;
  fStack_20c = fStack_450;
  fStack_594 = local_598;
  fStack_590 = local_598;
  fStack_58c = local_598;
  fStack_584 = local_588;
  fStack_580 = local_588;
  fStack_57c = local_588;
  fStack_540 = local_588;
  fStack_53c = local_598;
  fStack_524 = local_528;
  fStack_520 = local_528;
  fStack_51c = local_528;
  do {
    context = local_350;
    local_388 = local_2c8._4_4_ - (float)local_2c8;
    fStack_384 = local_388;
    fStack_380 = local_388;
    fStack_37c = local_388;
    local_398 = (float)local_2c8;
    fStack_394 = (float)local_2c8;
    fStack_390 = (float)local_2c8;
    fStack_38c = (float)local_2c8;
    fVar193 = local_388 * 0.0 + (float)local_2c8;
    fVar194 = local_388 * 0.33333334 + (float)local_2c8;
    fVar195 = local_388 * 0.6666667 + (float)local_2c8;
    fVar210 = local_388 * 1.0 + (float)local_2c8;
    fVar82 = (float)DAT_01feca10;
    fVar172 = fVar82 - fVar193;
    fVar124 = DAT_01feca10._4_4_;
    fVar83 = fVar124 - fVar194;
    fVar153 = DAT_01feca10._8_4_;
    fVar171 = DAT_01feca10._12_4_;
    fVar125 = fVar153 - fVar195;
    fVar174 = fVar171 - fVar210;
    fVar211 = local_1f8 * fVar172 + local_138 * fVar193;
    fVar212 = fStack_1f4 * fVar83 + fStack_134 * fVar194;
    fVar234 = fStack_1f0 * fVar125 + fStack_130 * fVar195;
    fVar235 = fStack_1ec * fVar174 + fStack_12c * fVar210;
    fVar294 = local_208 * fVar172 + local_148 * fVar193;
    fVar298 = fStack_204 * fVar83 + fStack_144 * fVar194;
    fVar300 = fStack_200 * fVar125 + fStack_140 * fVar195;
    fVar309 = fStack_1fc * fVar174 + fStack_13c * fVar210;
    fVar310 = local_588 * fVar172 + local_218 * fVar193;
    fVar311 = fStack_584 * fVar83 + fStack_214 * fVar194;
    fVar312 = fStack_580 * fVar125 + fStack_210 * fVar195;
    fVar315 = fStack_57c * fVar174 + fStack_20c * fVar210;
    fVar278 = local_598 * fVar172 + local_258 * fVar193;
    fVar285 = fStack_594 * fVar83 + fStack_254 * fVar194;
    fVar286 = fStack_590 * fVar125 + fStack_250 * fVar195;
    fVar287 = fStack_58c * fVar174 + fStack_24c * fVar210;
    fVar236 = (local_1b8 * fVar172 + local_1f8 * fVar193) * fVar172 + fVar193 * fVar211;
    fVar239 = (fStack_1b4 * fVar83 + fStack_1f4 * fVar194) * fVar83 + fVar194 * fVar212;
    fVar240 = (fStack_1b0 * fVar125 + fStack_1f0 * fVar195) * fVar125 + fVar195 * fVar234;
    fVar241 = (fStack_1ac * fVar174 + fStack_1ec * fVar210) * fVar174 + fVar210 * fVar235;
    fVar250 = (local_1c8 * fVar172 + local_208 * fVar193) * fVar172 + fVar193 * fVar294;
    fVar251 = (fStack_1c4 * fVar83 + fStack_204 * fVar194) * fVar83 + fVar194 * fVar298;
    fVar252 = (fStack_1c0 * fVar125 + fStack_200 * fVar195) * fVar125 + fVar195 * fVar300;
    fVar263 = (fStack_1bc * fVar174 + fStack_1fc * fVar210) * fVar174 + fVar210 * fVar309;
    fVar126 = (local_1d8 * fVar172 + local_588 * fVar193) * fVar172 + fVar193 * fVar310;
    fVar151 = (fStack_1d4 * fVar83 + fStack_584 * fVar194) * fVar83 + fVar194 * fVar311;
    fVar264 = (fStack_1d0 * fVar125 + fStack_580 * fVar195) * fVar125 + fVar195 * fVar312;
    fVar152 = (fStack_1cc * fVar174 + fStack_57c * fVar210) * fVar174 + fVar210 * fVar315;
    fVar265 = (local_1e8 * fVar172 + local_598 * fVar193) * fVar172 + fVar193 * fVar278;
    fVar276 = (fStack_1e4 * fVar83 + fStack_594 * fVar194) * fVar83 + fVar194 * fVar285;
    fVar277 = (fStack_1e0 * fVar125 + fStack_590 * fVar195) * fVar125 + fVar195 * fVar286;
    fVar173 = (fStack_1dc * fVar174 + fStack_58c * fVar210) * fVar174 + fVar210 * fVar287;
    fVar211 = fVar211 * fVar172 + (local_138 * fVar172 + local_158 * fVar193) * fVar193;
    fVar212 = fVar212 * fVar83 + (fStack_134 * fVar83 + fStack_154 * fVar194) * fVar194;
    fVar234 = fVar234 * fVar125 + (fStack_130 * fVar125 + fStack_150 * fVar195) * fVar195;
    fVar235 = fVar235 * fVar174 + (fStack_12c * fVar174 + fStack_14c * fVar210) * fVar210;
    fVar296 = fVar294 * fVar172 + (local_148 * fVar172 + local_168 * fVar193) * fVar193;
    fVar298 = fVar298 * fVar83 + (fStack_144 * fVar83 + fStack_164 * fVar194) * fVar194;
    fVar300 = fVar300 * fVar125 + (fStack_140 * fVar125 + fStack_160 * fVar195) * fVar195;
    fVar309 = fVar309 * fVar174 + (fStack_13c * fVar174 + fStack_15c * fVar210) * fVar210;
    fVar317 = fVar310 * fVar172 + (local_218 * fVar172 + local_178 * fVar193) * fVar193;
    fVar295 = fVar311 * fVar83 + (fStack_214 * fVar83 + fStack_174 * fVar194) * fVar194;
    fVar297 = fVar312 * fVar125 + (fStack_210 * fVar125 + fStack_170 * fVar195) * fVar195;
    fVar299 = fVar315 * fVar174 + (fStack_20c * fVar174 + fStack_16c * fVar210) * fVar210;
    fVar278 = fVar278 * fVar172 + (local_258 * fVar172 + local_188 * fVar193) * fVar193;
    fVar285 = fVar285 * fVar83 + (fStack_254 * fVar83 + fStack_184 * fVar194) * fVar194;
    fVar286 = fVar286 * fVar125 + (fStack_250 * fVar125 + fStack_180 * fVar195) * fVar195;
    fVar287 = fVar287 * fVar174 + (fStack_24c * fVar174 + fStack_17c * fVar210) * fVar210;
    fVar310 = fVar172 * fVar236 + fVar193 * fVar211;
    fVar311 = fVar83 * fVar239 + fVar194 * fVar212;
    fVar312 = fVar125 * fVar240 + fVar195 * fVar234;
    fVar315 = fVar174 * fVar241 + fVar210 * fVar235;
    fVar313 = fVar172 * fVar250 + fVar193 * fVar296;
    fVar316 = fVar83 * fVar251 + fVar194 * fVar298;
    fVar318 = fVar125 * fVar252 + fVar195 * fVar300;
    fVar319 = fVar174 * fVar263 + fVar210 * fVar309;
    local_3d8 = fVar172 * fVar126 + fVar193 * fVar317;
    fStack_3d4 = fVar83 * fVar151 + fVar194 * fVar295;
    fStack_3d0 = fVar125 * fVar264 + fVar195 * fVar297;
    fStack_3cc = fVar174 * fVar152 + fVar210 * fVar299;
    fVar294 = local_388 * 0.11111111;
    fVar172 = fVar172 * fVar265 + fVar193 * fVar278;
    fVar83 = fVar83 * fVar276 + fVar194 * fVar285;
    uVar84 = CONCAT44(fVar83,fVar172);
    fVar125 = fVar125 * fVar277 + fVar195 * fVar286;
    fVar174 = fVar174 * fVar173 + fVar210 * fVar287;
    local_518 = (fVar211 - fVar236) * 3.0 * fVar294;
    fStack_514 = (fVar212 - fVar239) * 3.0 * fVar294;
    fStack_510 = (fVar234 - fVar240) * 3.0 * fVar294;
    fStack_50c = (fVar235 - fVar241) * 3.0 * fVar294;
    local_578._0_4_ = (fVar296 - fVar250) * 3.0 * fVar294;
    local_4c8 = (fVar298 - fVar251) * 3.0 * fVar294;
    fStack_4c4 = (fVar300 - fVar252) * 3.0 * fVar294;
    fStack_4c0 = (fVar309 - fVar263) * 3.0 * fVar294;
    local_558 = (fVar317 - fVar126) * 3.0 * fVar294;
    local_508 = (fVar295 - fVar151) * 3.0 * fVar294;
    fStack_504 = (fVar297 - fVar264) * 3.0 * fVar294;
    fStack_500 = (fVar299 - fVar152) * 3.0 * fVar294;
    fVar193 = fVar294 * (fVar285 - fVar276) * 3.0;
    fVar194 = fVar294 * (fVar286 - fVar277) * 3.0;
    fVar195 = fVar294 * (fVar287 - fVar173) * 3.0;
    local_568._4_4_ = fVar312;
    local_568._0_4_ = fVar311;
    fStack_560 = fVar315;
    fStack_55c = 0.0;
    local_4b8._4_4_ = fVar318;
    local_4b8._0_4_ = fVar316;
    fStack_4b0 = fVar319;
    fStack_4ac = 0.0;
    local_368._4_4_ = fStack_3d0;
    local_368._0_4_ = fStack_3d4;
    fStack_360 = fStack_3cc;
    fStack_35c = 0.0;
    auVar320._4_4_ = fVar125;
    auVar320._0_4_ = fVar83;
    auVar320._8_4_ = fVar174;
    auVar320._12_4_ = 0;
    local_5e8._4_4_ = fVar83 + fVar193;
    local_5e8._0_4_ = fVar172 + fVar294 * (fVar278 - fVar265) * 3.0;
    fStack_5e0 = fVar125 + fVar194;
    fStack_5dc = fVar174 + fVar195;
    auVar321._0_8_ = CONCAT44(fVar125 - fVar194,fVar83 - fVar193);
    auVar321._8_4_ = fVar174 - fVar195;
    auVar321._12_4_ = 0;
    local_3f8._0_4_ = fVar316 - fVar313;
    local_3f8._4_4_ = fVar318 - fVar316;
    fStack_3f0 = fVar319 - fVar318;
    fStack_3ec = 0.0 - fVar319;
    local_408._0_4_ = fStack_3d4 - local_3d8;
    local_408._4_4_ = fStack_3d0 - fStack_3d4;
    fStack_400 = fStack_3cc - fStack_3d0;
    fStack_3fc = 0.0 - fStack_3cc;
    fVar172 = (float)local_578._0_4_ * (float)local_408._0_4_ - local_558 * (float)local_3f8._0_4_;
    fVar83 = local_4c8 * (float)local_408._4_4_ - local_508 * (float)local_3f8._4_4_;
    fVar193 = fStack_4c4 * fStack_400 - fStack_504 * fStack_3f0;
    fVar194 = fStack_4c0 * fStack_3fc - fStack_500 * fStack_3ec;
    local_2e8._0_4_ = fVar311 - fVar310;
    local_2e8._4_4_ = fVar312 - fVar311;
    fStack_2e0 = fVar315 - fVar312;
    fStack_2dc = 0.0 - fVar315;
    fVar195 = local_558 * (float)local_2e8._0_4_ - local_518 * (float)local_408._0_4_;
    fVar211 = local_508 * (float)local_2e8._4_4_ - fStack_514 * (float)local_408._4_4_;
    fVar234 = fStack_504 * fStack_2e0 - fStack_510 * fStack_400;
    fVar236 = fStack_500 * fStack_2dc - fStack_50c * fStack_3fc;
    fVar210 = local_518 * (float)local_3f8._0_4_ - (float)local_578._0_4_ * (float)local_2e8._0_4_;
    fVar212 = fStack_514 * (float)local_3f8._4_4_ - local_4c8 * (float)local_2e8._4_4_;
    fVar235 = fStack_510 * fStack_3f0 - fStack_4c4 * fStack_2e0;
    fVar239 = fStack_50c * fStack_3ec - fStack_4c0 * fStack_2dc;
    auVar247._0_4_ = fVar210 * fVar210;
    auVar247._4_4_ = fVar212 * fVar212;
    auVar247._8_4_ = fVar235 * fVar235;
    auVar247._12_4_ = fVar239 * fVar239;
    auVar181._0_4_ =
         (float)local_2e8._0_4_ * (float)local_2e8._0_4_ +
         (float)local_3f8._0_4_ * (float)local_3f8._0_4_ +
         (float)local_408._0_4_ * (float)local_408._0_4_;
    auVar181._4_4_ =
         (float)local_2e8._4_4_ * (float)local_2e8._4_4_ +
         (float)local_3f8._4_4_ * (float)local_3f8._4_4_ +
         (float)local_408._4_4_ * (float)local_408._4_4_;
    auVar181._8_4_ = fStack_2e0 * fStack_2e0 + fStack_3f0 * fStack_3f0 + fStack_400 * fStack_400;
    auVar181._12_4_ = fStack_2dc * fStack_2dc + fStack_3ec * fStack_3ec + fStack_3fc * fStack_3fc;
    auVar85 = rcpps(auVar247,auVar181);
    fVar210 = auVar85._0_4_;
    fVar212 = auVar85._4_4_;
    fVar235 = auVar85._8_4_;
    fVar239 = auVar85._12_4_;
    fVar210 = (1.0 - fVar210 * auVar181._0_4_) * fVar210 + fVar210;
    fVar212 = (1.0 - fVar212 * auVar181._4_4_) * fVar212 + fVar212;
    fVar235 = (1.0 - fVar235 * auVar181._8_4_) * fVar235 + fVar235;
    fVar239 = (1.0 - fVar239 * auVar181._12_4_) * fVar239 + fVar239;
    local_578._4_4_ = local_4c8;
    fStack_570 = fStack_4c4;
    fStack_56c = fStack_4c0;
    auVar271._8_4_ = fVar125;
    auVar271._0_8_ = uVar84;
    auVar271._12_4_ = fVar174;
    fVar240 = (float)local_408._0_4_ * local_4c8 - (float)local_3f8._0_4_ * local_508;
    fVar241 = (float)local_408._4_4_ * fStack_4c4 - (float)local_3f8._4_4_ * fStack_504;
    fVar250 = fStack_400 * fStack_4c0 - fStack_3f0 * fStack_500;
    fVar251 = fStack_3fc * 0.0 - fStack_3ec * 0.0;
    fStack_4fc = 0.0;
    fVar252 = (float)local_2e8._0_4_ * local_508 - (float)local_408._0_4_ * fStack_514;
    fVar263 = (float)local_2e8._4_4_ * fStack_504 - (float)local_408._4_4_ * fStack_510;
    fVar126 = fStack_2e0 * fStack_500 - fStack_400 * fStack_50c;
    fVar151 = fStack_2dc * 0.0 - fStack_3fc * 0.0;
    uStack_4bc = 0;
    uStack_4ec = 0;
    fVar264 = (float)local_3f8._0_4_ * fStack_514 - (float)local_2e8._0_4_ * local_4c8;
    fVar152 = (float)local_3f8._4_4_ * fStack_510 - (float)local_2e8._4_4_ * fStack_4c4;
    fVar265 = fStack_3f0 * fStack_50c - fStack_2e0 * fStack_4c0;
    fVar276 = fStack_3ec * 0.0 - fStack_2dc * 0.0;
    auVar137._0_4_ = (fVar172 * fVar172 + fVar195 * fVar195 + auVar247._0_4_) * fVar210;
    auVar137._4_4_ = (fVar83 * fVar83 + fVar211 * fVar211 + auVar247._4_4_) * fVar212;
    auVar137._8_4_ = (fVar193 * fVar193 + fVar234 * fVar234 + auVar247._8_4_) * fVar235;
    auVar137._12_4_ = (fVar194 * fVar194 + fVar236 * fVar236 + auVar247._12_4_) * fVar239;
    auVar253._0_4_ = (fVar240 * fVar240 + fVar252 * fVar252 + fVar264 * fVar264) * fVar210;
    auVar253._4_4_ = (fVar241 * fVar241 + fVar263 * fVar263 + fVar152 * fVar152) * fVar212;
    auVar253._8_4_ = (fVar250 * fVar250 + fVar126 * fVar126 + fVar265 * fVar265) * fVar235;
    auVar253._12_4_ = (fVar251 * fVar251 + fVar151 * fVar151 + fVar276 * fVar276) * fVar239;
    auVar85 = maxps(auVar137,auVar253);
    auVar248._8_4_ = fVar125;
    auVar248._0_8_ = uVar84;
    auVar248._12_4_ = fVar174;
    auVar270 = maxps(auVar248,_local_5e8);
    auVar229._8_4_ = auVar321._8_4_;
    auVar229._0_8_ = auVar321._0_8_;
    auVar229._12_4_ = 0;
    auVar155 = maxps(auVar229,auVar320);
    auVar155 = maxps(auVar270,auVar155);
    auVar270 = minps(auVar271,_local_5e8);
    auVar322 = minps(auVar321,auVar320);
    auVar322 = minps(auVar270,auVar322);
    auVar85 = sqrtps(auVar320,auVar85);
    auVar270 = rsqrtps(auVar253,auVar181);
    fVar172 = auVar270._0_4_;
    fVar83 = auVar270._4_4_;
    fVar125 = auVar270._8_4_;
    fVar174 = auVar270._12_4_;
    local_5a8._0_4_ = fVar172 * fVar172 * auVar181._0_4_ * -0.5 * fVar172 + fVar172 * 1.5;
    local_5a8._4_4_ = fVar83 * fVar83 * auVar181._4_4_ * -0.5 * fVar83 + fVar83 * 1.5;
    fStack_5a0 = fVar125 * fVar125 * auVar181._8_4_ * -0.5 * fVar125 + fVar125 * 1.5;
    fStack_59c = fVar174 * fVar174 * auVar181._12_4_ * -0.5 * fVar174 + fVar174 * 1.5;
    fVar236 = 0.0 - fVar313;
    fVar239 = 0.0 - fVar316;
    fVar240 = 0.0 - fVar318;
    fVar241 = 0.0 - fVar319;
    local_378 = 0.0 - local_3d8;
    fStack_374 = 0.0 - fStack_3d4;
    fStack_370 = 0.0 - fStack_3d0;
    fStack_36c = 0.0 - fStack_3cc;
    fVar250 = 0.0 - fVar310;
    fVar251 = 0.0 - fVar311;
    fVar252 = 0.0 - fVar312;
    fVar263 = 0.0 - fVar315;
    auVar230._0_4_ =
         local_348 * (float)local_3f8._0_4_ * (float)local_5a8._0_4_ +
         local_3e8 * (float)local_408._0_4_ * (float)local_5a8._0_4_;
    auVar230._4_4_ =
         fStack_344 * (float)local_3f8._4_4_ * (float)local_5a8._4_4_ +
         fStack_3e4 * (float)local_408._4_4_ * (float)local_5a8._4_4_;
    auVar230._8_4_ = fStack_340 * fStack_3f0 * fStack_5a0 + fStack_3e0 * fStack_400 * fStack_5a0;
    auVar230._12_4_ = fStack_33c * fStack_3ec * fStack_59c + fStack_3dc * fStack_3fc * fStack_59c;
    local_2f8._0_4_ = local_2d8 * (float)local_2e8._0_4_ * (float)local_5a8._0_4_ + auVar230._0_4_;
    local_2f8._4_4_ = fStack_2d4 * (float)local_2e8._4_4_ * (float)local_5a8._4_4_ + auVar230._4_4_;
    local_2f8._8_4_ = fStack_2d0 * fStack_2e0 * fStack_5a0 + auVar230._8_4_;
    local_2f8._12_4_ = fStack_2cc * fStack_2dc * fStack_59c + auVar230._12_4_;
    fVar211 = (float)local_2e8._0_4_ * (float)local_5a8._0_4_ * fVar250 +
              (float)local_3f8._0_4_ * (float)local_5a8._0_4_ * fVar236 +
              (float)local_408._0_4_ * (float)local_5a8._0_4_ * local_378;
    fVar212 = (float)local_2e8._4_4_ * (float)local_5a8._4_4_ * fVar251 +
              (float)local_3f8._4_4_ * (float)local_5a8._4_4_ * fVar239 +
              (float)local_408._4_4_ * (float)local_5a8._4_4_ * fStack_374;
    fVar234 = fStack_2e0 * fStack_5a0 * fVar252 +
              fStack_3f0 * fStack_5a0 * fVar240 + fStack_400 * fStack_5a0 * fStack_370;
    fVar235 = fStack_2dc * fStack_59c * fVar263 +
              fStack_3ec * fStack_59c * fVar241 + fStack_3fc * fStack_59c * fStack_36c;
    local_468._0_4_ =
         (local_2d8 * fVar250 + local_348 * fVar236 + local_3e8 * local_378) -
         (float)local_2f8._0_4_ * fVar211;
    local_468._4_4_ =
         (fStack_2d4 * fVar251 + fStack_344 * fVar239 + fStack_3e4 * fStack_374) -
         (float)local_2f8._4_4_ * fVar212;
    fStack_460 = (fStack_2d0 * fVar252 + fStack_340 * fVar240 + fStack_3e0 * fStack_370) -
                 (float)local_2f8._8_4_ * fVar234;
    fStack_45c = (fStack_2cc * fVar263 + fStack_33c * fVar241 + fStack_3dc * fStack_36c) -
                 (float)local_2f8._12_4_ * fVar235;
    fVar126 = (fVar250 * fVar250 + fVar236 * fVar236 + local_378 * local_378) - fVar211 * fVar211;
    fVar151 = (fVar251 * fVar251 + fVar239 * fVar239 + fStack_374 * fStack_374) - fVar212 * fVar212;
    fVar264 = (fVar252 * fVar252 + fVar240 * fVar240 + fStack_370 * fStack_370) - fVar234 * fVar234;
    fVar152 = (fVar263 * fVar263 + fVar241 * fVar241 + fStack_36c * fStack_36c) - fVar235 * fVar235;
    fVar172 = (auVar155._0_4_ + auVar85._0_4_) * 1.0000002;
    fVar83 = (auVar155._4_4_ + auVar85._4_4_) * 1.0000002;
    fVar125 = (auVar155._8_4_ + auVar85._8_4_) * 1.0000002;
    fVar174 = (auVar155._12_4_ + auVar85._12_4_) * 1.0000002;
    fVar172 = fVar126 - fVar172 * fVar172;
    fVar83 = fVar151 - fVar83 * fVar83;
    fVar125 = fVar264 - fVar125 * fVar125;
    fVar174 = fVar152 - fVar174 * fVar174;
    local_308 = (float)local_2f8._0_4_ * (float)local_2f8._0_4_;
    fStack_304 = (float)local_2f8._4_4_ * (float)local_2f8._4_4_;
    fStack_300 = (float)local_2f8._8_4_ * (float)local_2f8._8_4_;
    fStack_2fc = (float)local_2f8._12_4_ * (float)local_2f8._12_4_;
    fVar193 = local_128 - local_308;
    fVar194 = fStack_124 - fStack_304;
    fVar195 = fStack_120 - fStack_300;
    fVar210 = fStack_11c - fStack_2fc;
    local_468._0_4_ = (float)local_468._0_4_ + (float)local_468._0_4_;
    local_468._4_4_ = (float)local_468._4_4_ + (float)local_468._4_4_;
    fStack_460 = fStack_460 + fStack_460;
    fStack_45c = fStack_45c + fStack_45c;
    local_3b8._0_4_ = fVar193 * 4.0;
    local_3b8._4_4_ = fVar194 * 4.0;
    fStack_3b0 = fVar195 * 4.0;
    fStack_3ac = fVar210 * 4.0;
    auVar249._0_4_ =
         (float)local_468._0_4_ * (float)local_468._0_4_ - (float)local_3b8._0_4_ * fVar172;
    auVar249._4_4_ =
         (float)local_468._4_4_ * (float)local_468._4_4_ - (float)local_3b8._4_4_ * fVar83;
    auVar249._8_4_ = fStack_460 * fStack_460 - fStack_3b0 * fVar125;
    auVar249._12_4_ = fStack_45c * fStack_45c - fStack_3ac * fVar174;
    local_3a8 = (auVar322._0_4_ - auVar85._0_4_) * 0.99999976;
    fStack_3a4 = (auVar322._4_4_ - auVar85._4_4_) * 0.99999976;
    fStack_3a0 = (auVar322._8_4_ - auVar85._8_4_) * 0.99999976;
    fStack_39c = (auVar322._12_4_ - auVar85._12_4_) * 0.99999976;
    auVar272._4_4_ = -(uint)(0.0 <= auVar249._4_4_);
    auVar272._0_4_ = -(uint)(0.0 <= auVar249._0_4_);
    auVar272._8_4_ = -(uint)(0.0 <= auVar249._8_4_);
    auVar272._12_4_ = -(uint)(0.0 <= auVar249._12_4_);
    uVar69 = (undefined4)((ulong)lVar62 >> 0x20);
    iVar59 = movmskps((int)lVar62,auVar272);
    if (iVar59 == 0) {
      iVar59 = 0;
      auVar139 = _DAT_01feb9f0;
      auVar232 = _DAT_01feba00;
    }
    else {
      auVar155 = sqrtps(_local_5a8,auVar249);
      bVar21 = 0.0 <= auVar249._0_4_;
      uVar77 = -(uint)bVar21;
      bVar22 = 0.0 <= auVar249._4_4_;
      uVar78 = -(uint)bVar22;
      bVar23 = 0.0 <= auVar249._8_4_;
      uVar79 = -(uint)bVar23;
      bVar24 = 0.0 <= auVar249._12_4_;
      uVar80 = -(uint)bVar24;
      auVar138._0_4_ = fVar193 + fVar193;
      auVar138._4_4_ = fVar194 + fVar194;
      auVar138._8_4_ = fVar195 + fVar195;
      auVar138._12_4_ = fVar210 + fVar210;
      auVar85 = rcpps(auVar230,auVar138);
      fVar265 = auVar85._0_4_;
      fVar277 = auVar85._4_4_;
      fVar278 = auVar85._8_4_;
      fVar286 = auVar85._12_4_;
      fVar265 = (1.0 - auVar138._0_4_ * fVar265) * fVar265 + fVar265;
      fVar277 = (1.0 - auVar138._4_4_ * fVar277) * fVar277 + fVar277;
      fVar278 = (1.0 - auVar138._8_4_ * fVar278) * fVar278 + fVar278;
      fVar286 = (1.0 - auVar138._12_4_ * fVar286) * fVar286 + fVar286;
      fVar276 = (-(float)local_468._0_4_ - auVar155._0_4_) * fVar265;
      fVar173 = (-(float)local_468._4_4_ - auVar155._4_4_) * fVar277;
      fVar285 = (-fStack_460 - auVar155._8_4_) * fVar278;
      fVar287 = (-fStack_45c - auVar155._12_4_) * fVar286;
      fVar265 = (auVar155._0_4_ - (float)local_468._0_4_) * fVar265;
      fVar277 = (auVar155._4_4_ - (float)local_468._4_4_) * fVar277;
      fVar278 = (auVar155._8_4_ - fStack_460) * fVar278;
      fVar286 = (auVar155._12_4_ - fStack_45c) * fVar286;
      local_298[0] = ((float)local_2f8._0_4_ * fVar276 + fVar211) * (float)local_5a8._0_4_;
      local_298[1] = ((float)local_2f8._4_4_ * fVar173 + fVar212) * (float)local_5a8._4_4_;
      local_298[2] = ((float)local_2f8._8_4_ * fVar285 + fVar234) * fStack_5a0;
      local_298[3] = ((float)local_2f8._12_4_ * fVar287 + fVar235) * fStack_59c;
      local_2a8._0_4_ = ((float)local_2f8._0_4_ * fVar265 + fVar211) * (float)local_5a8._0_4_;
      local_2a8._4_4_ = ((float)local_2f8._4_4_ * fVar277 + fVar212) * (float)local_5a8._4_4_;
      fStack_2a0 = ((float)local_2f8._8_4_ * fVar278 + fVar234) * fStack_5a0;
      fStack_29c = ((float)local_2f8._12_4_ * fVar286 + fVar235) * fStack_59c;
      auVar231._0_4_ = (uint)fVar276 & uVar77;
      auVar231._4_4_ = (uint)fVar173 & uVar78;
      auVar231._8_4_ = (uint)fVar285 & uVar79;
      auVar231._12_4_ = (uint)fVar287 & uVar80;
      auVar139._0_8_ = CONCAT44(~uVar78,~uVar77) & 0x7f8000007f800000;
      auVar139._8_4_ = ~uVar79 & 0x7f800000;
      auVar139._12_4_ = ~uVar80 & 0x7f800000;
      auVar139 = auVar139 | auVar231;
      auVar254._0_4_ = (uint)fVar265 & uVar77;
      auVar254._4_4_ = (uint)fVar277 & uVar78;
      auVar254._8_4_ = (uint)fVar278 & uVar79;
      auVar254._12_4_ = (uint)fVar286 & uVar80;
      auVar232._0_8_ = CONCAT44(~uVar78,~uVar77) & 0xff800000ff800000;
      auVar232._8_4_ = ~uVar79 & 0xff800000;
      auVar232._12_4_ = ~uVar80 & 0xff800000;
      auVar232 = auVar232 | auVar254;
      auVar255._0_8_ = CONCAT44(fStack_304,local_308) & 0x7fffffff7fffffff;
      auVar255._8_4_ = ABS(fStack_300);
      auVar255._12_4_ = ABS(fStack_2fc);
      auVar35._4_4_ = fStack_264;
      auVar35._0_4_ = local_268;
      auVar35._8_4_ = fStack_260;
      auVar35._12_4_ = fStack_25c;
      auVar85 = maxps(auVar35,auVar255);
      fVar265 = auVar85._0_4_ * 1.9073486e-06;
      fVar276 = auVar85._4_4_ * 1.9073486e-06;
      fVar277 = auVar85._8_4_ * 1.9073486e-06;
      fVar173 = auVar85._12_4_ * 1.9073486e-06;
      auVar256._0_4_ = -(uint)(ABS(fVar193) < fVar265 && bVar21);
      auVar256._4_4_ = -(uint)(ABS(fVar194) < fVar276 && bVar22);
      auVar256._8_4_ = -(uint)(ABS(fVar195) < fVar277 && bVar23);
      auVar256._12_4_ = -(uint)(ABS(fVar210) < fVar173 && bVar24);
      iVar59 = movmskps(iVar59,auVar256);
      if (iVar59 != 0) {
        uVar77 = -(uint)(fVar172 <= 0.0);
        uVar78 = -(uint)(fVar83 <= 0.0);
        uVar79 = -(uint)(fVar125 <= 0.0);
        uVar80 = -(uint)(fVar174 <= 0.0);
        auVar314._0_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar256._0_4_;
        auVar314._4_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar256._4_4_;
        auVar314._8_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar256._8_4_;
        auVar314._12_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar256._12_4_;
        auVar197._0_4_ = ~auVar256._0_4_ & auVar139._0_4_;
        auVar197._4_4_ = ~auVar256._4_4_ & auVar139._4_4_;
        auVar197._8_4_ = ~auVar256._8_4_ & auVar139._8_4_;
        auVar197._12_4_ = ~auVar256._12_4_ & auVar139._12_4_;
        auVar198._0_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar256._0_4_;
        auVar198._4_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar256._4_4_;
        auVar198._8_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar256._8_4_;
        auVar198._12_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar256._12_4_;
        auVar257._0_4_ = ~auVar256._0_4_ & auVar232._0_4_;
        auVar257._4_4_ = ~auVar256._4_4_ & auVar232._4_4_;
        auVar257._8_4_ = ~auVar256._8_4_ & auVar232._8_4_;
        auVar257._12_4_ = ~auVar256._12_4_ & auVar232._12_4_;
        auVar272._4_4_ = -(uint)((fVar276 <= ABS(fVar194) || fVar83 <= 0.0) && bVar22);
        auVar272._0_4_ = -(uint)((fVar265 <= ABS(fVar193) || fVar172 <= 0.0) && bVar21);
        auVar272._8_4_ = -(uint)((fVar277 <= ABS(fVar195) || fVar125 <= 0.0) && bVar23);
        auVar272._12_4_ = -(uint)((fVar173 <= ABS(fVar210) || fVar174 <= 0.0) && bVar24);
        auVar139 = auVar197 | auVar314;
        auVar232 = auVar257 | auVar198;
      }
    }
    auVar273._0_4_ = (auVar272._0_4_ << 0x1f) >> 0x1f;
    auVar273._4_4_ = (auVar272._4_4_ << 0x1f) >> 0x1f;
    auVar273._8_4_ = (auVar272._8_4_ << 0x1f) >> 0x1f;
    auVar273._12_4_ = (auVar272._12_4_ << 0x1f) >> 0x1f;
    auVar273 = auVar273 & local_198;
    iVar59 = movmskps(iVar59,auVar273);
    lVar62 = CONCAT44(uVar69,iVar59);
    fStack_554 = local_508;
    fStack_550 = fStack_504;
    fStack_54c = fStack_500;
    local_4f8 = fStack_514;
    fStack_4f4 = fStack_510;
    fStack_4f0 = fStack_50c;
    if (iVar59 != 0) {
      local_1a8 = fVar211;
      fStack_1a4 = fVar212;
      fStack_1a0 = fVar234;
      fStack_19c = fVar235;
      local_278 = fVar193;
      fStack_274 = fVar194;
      fStack_270 = fVar195;
      fStack_26c = fVar210;
      local_4d8._4_4_ = fVar151;
      local_4d8._0_4_ = fVar126;
      fStack_4d0 = fVar264;
      fStack_4cc = fVar152;
      auVar323._0_4_ = (ray->org).field_0.m128[3] - (float)local_2b8._0_4_;
      auVar323._4_4_ = auVar323._0_4_;
      auVar323._8_4_ = auVar323._0_4_;
      auVar323._12_4_ = auVar323._0_4_;
      auVar270 = maxps(auVar323,auVar139);
      auVar199._0_4_ = ray->tfar - (float)local_2b8._0_4_;
      auVar199._4_4_ = auVar199._0_4_;
      auVar199._8_4_ = auVar199._0_4_;
      auVar199._12_4_ = auVar199._0_4_;
      auVar155 = minps(auVar199,auVar232);
      auVar107._0_4_ = local_378 * local_558;
      auVar107._4_4_ = fStack_374 * local_508;
      auVar107._8_4_ = fStack_370 * fStack_504;
      auVar107._12_4_ = fStack_36c * fStack_500;
      auVar156._0_4_ =
           local_518 * local_2d8 + (float)local_578._0_4_ * local_348 + local_558 * local_3e8;
      auVar156._4_4_ = fStack_514 * fStack_2d4 + local_4c8 * fStack_344 + local_508 * fStack_3e4;
      auVar156._8_4_ = fStack_510 * fStack_2d0 + fStack_4c4 * fStack_340 + fStack_504 * fStack_3e0;
      auVar156._12_4_ = fStack_50c * fStack_2cc + fStack_4c0 * fStack_33c + fStack_500 * fStack_3dc;
      auVar85 = rcpps(auVar107,auVar156);
      fVar172 = auVar85._0_4_;
      fVar83 = auVar85._4_4_;
      fVar125 = auVar85._8_4_;
      fVar174 = auVar85._12_4_;
      fVar172 = ((fVar82 - auVar156._0_4_ * fVar172) * fVar172 + fVar172) *
                -(fVar250 * local_518 + fVar236 * (float)local_578._0_4_ + auVar107._0_4_);
      fVar83 = ((fVar124 - auVar156._4_4_ * fVar83) * fVar83 + fVar83) *
               -(fVar251 * fStack_514 + fVar239 * local_4c8 + auVar107._4_4_);
      fVar125 = ((fVar153 - auVar156._8_4_ * fVar125) * fVar125 + fVar125) *
                -(fVar252 * fStack_510 + fVar240 * fStack_4c4 + auVar107._8_4_);
      fVar174 = ((fVar171 - auVar156._12_4_ * fVar174) * fVar174 + fVar174) *
                -(fVar263 * fStack_50c + fVar241 * fStack_4c0 + auVar107._12_4_);
      auVar238._0_12_ = ZEXT812(0);
      auVar238._12_4_ = 0.0;
      uVar77 = -(uint)(auVar156._0_4_ < 0.0 || ABS(auVar156._0_4_) < 1e-18);
      uVar78 = -(uint)(auVar156._4_4_ < 0.0 || ABS(auVar156._4_4_) < 1e-18);
      uVar79 = -(uint)(auVar156._8_4_ < 0.0 || ABS(auVar156._8_4_) < 1e-18);
      uVar80 = -(uint)(auVar156._12_4_ < 0.0 || ABS(auVar156._12_4_) < 1e-18);
      auVar233._0_8_ = CONCAT44(uVar78,uVar77) & 0xff800000ff800000;
      auVar233._8_4_ = uVar79 & 0xff800000;
      auVar233._12_4_ = uVar80 & 0xff800000;
      auVar108._0_4_ = ~uVar77 & (uint)fVar172;
      auVar108._4_4_ = ~uVar78 & (uint)fVar83;
      auVar108._8_4_ = ~uVar79 & (uint)fVar125;
      auVar108._12_4_ = ~uVar80 & (uint)fVar174;
      auVar270 = maxps(auVar270,auVar108 | auVar233);
      uVar77 = -(uint)(0.0 < auVar156._0_4_ || ABS(auVar156._0_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar156._4_4_ || ABS(auVar156._4_4_) < 1e-18);
      uVar79 = -(uint)(0.0 < auVar156._8_4_ || ABS(auVar156._8_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar156._12_4_ || ABS(auVar156._12_4_) < 1e-18);
      auVar109._0_8_ = CONCAT44(uVar78,uVar77) & 0x7f8000007f800000;
      auVar109._8_4_ = uVar79 & 0x7f800000;
      auVar109._12_4_ = uVar80 & 0x7f800000;
      auVar157._0_4_ = ~uVar77 & (uint)fVar172;
      auVar157._4_4_ = ~uVar78 & (uint)fVar83;
      auVar157._8_4_ = ~uVar79 & (uint)fVar125;
      auVar157._12_4_ = ~uVar80 & (uint)fVar174;
      auVar155 = minps(auVar155,auVar157 | auVar109);
      auVar140._0_4_ = (0.0 - fVar316) * -local_4c8 + (0.0 - fStack_3d4) * -local_508;
      auVar140._4_4_ = (0.0 - fVar318) * -fStack_4c4 + (0.0 - fStack_3d0) * -fStack_504;
      auVar140._8_4_ = (0.0 - fVar319) * -fStack_4c0 + (0.0 - fStack_3cc) * -fStack_500;
      auVar140._12_4_ = 0x80000000;
      auVar158._0_4_ = -fStack_514 * local_2d8 + -local_4c8 * local_348 + -local_508 * local_3e8;
      auVar158._4_4_ =
           -fStack_510 * fStack_2d4 + -fStack_4c4 * fStack_344 + -fStack_504 * fStack_3e4;
      auVar158._8_4_ =
           -fStack_50c * fStack_2d0 + -fStack_4c0 * fStack_340 + -fStack_500 * fStack_3e0;
      auVar158._12_4_ = fStack_2cc * -0.0 + fStack_33c * -0.0 + fStack_3dc * -0.0;
      auVar85 = rcpps(auVar140,auVar158);
      fVar172 = auVar85._0_4_;
      fVar83 = auVar85._4_4_;
      fVar125 = auVar85._8_4_;
      fVar174 = auVar85._12_4_;
      auVar182._4_4_ = -(uint)(ABS(auVar158._4_4_) < 1e-18);
      auVar182._0_4_ = -(uint)(ABS(auVar158._0_4_) < 1e-18);
      auVar182._8_4_ = -(uint)(ABS(auVar158._8_4_) < 1e-18);
      auVar182._12_4_ = -(uint)(ABS(auVar158._12_4_) < 1e-18);
      fVar172 = ((fVar82 - auVar158._0_4_ * fVar172) * fVar172 + fVar172) *
                -((0.0 - fVar311) * -fStack_514 + auVar140._0_4_);
      fVar83 = ((fVar124 - auVar158._4_4_ * fVar83) * fVar83 + fVar83) *
               -((0.0 - fVar312) * -fStack_510 + auVar140._4_4_);
      fVar125 = ((fVar153 - auVar158._8_4_ * fVar125) * fVar125 + fVar125) *
                -((0.0 - fVar315) * -fStack_50c + auVar140._8_4_);
      fVar174 = ((fVar171 - auVar158._12_4_ * fVar174) * fVar174 + fVar174) * 0.0;
      auVar110._4_4_ = -(uint)(auVar158._4_4_ < 0.0);
      auVar110._0_4_ = -(uint)(auVar158._0_4_ < 0.0);
      auVar110._8_4_ = -(uint)(auVar158._8_4_ < 0.0);
      auVar110._12_4_ = -(uint)(auVar158._12_4_ < 0.0);
      auVar110 = auVar110 | auVar182;
      auVar141._0_8_ = auVar110._0_8_ & 0xff800000ff800000;
      auVar141._8_4_ = auVar110._8_4_ & 0xff800000;
      auVar141._12_4_ = auVar110._12_4_ & 0xff800000;
      auVar111._0_4_ = ~auVar110._0_4_ & (uint)fVar172;
      auVar111._4_4_ = ~auVar110._4_4_ & (uint)fVar83;
      auVar111._8_4_ = ~auVar110._8_4_ & (uint)fVar125;
      auVar111._12_4_ = ~auVar110._12_4_ & (uint)fVar174;
      local_3c8 = maxps(auVar270,auVar111 | auVar141);
      auVar159._4_4_ = -(uint)(0.0 < auVar158._4_4_);
      auVar159._0_4_ = -(uint)(0.0 < auVar158._0_4_);
      auVar159._8_4_ = -(uint)(0.0 < auVar158._8_4_);
      auVar159._12_4_ = -(uint)(0.0 < auVar158._12_4_);
      auVar159 = auVar159 | auVar182;
      auVar112._0_8_ = auVar159._0_8_ & 0x7f8000007f800000;
      auVar112._8_4_ = auVar159._8_4_ & 0x7f800000;
      auVar112._12_4_ = auVar159._12_4_ & 0x7f800000;
      auVar160._0_4_ = ~auVar159._0_4_ & (uint)fVar172;
      auVar160._4_4_ = ~auVar159._4_4_ & (uint)fVar83;
      auVar160._8_4_ = ~auVar159._8_4_ & (uint)fVar125;
      auVar160._12_4_ = ~auVar159._12_4_ & (uint)fVar174;
      _local_578 = minps(auVar155,auVar160 | auVar112);
      fVar174 = local_3c8._12_4_;
      fVar172 = local_3c8._0_4_;
      fVar83 = local_3c8._4_4_;
      fVar125 = local_3c8._8_4_;
      auVar307._0_4_ = (float)(-(uint)(fVar172 <= local_578._0_4_) & auVar273._0_4_);
      auVar307._4_4_ = -(uint)(fVar83 <= local_578._4_4_) & auVar273._4_4_;
      auVar307._8_4_ = -(uint)(fVar125 <= local_578._8_4_) & auVar273._8_4_;
      auVar307._12_4_ = -(uint)(fVar174 <= local_578._12_4_) & auVar273._12_4_;
      iVar59 = movmskps(iVar59,auVar307);
      lVar62 = CONCAT44(uVar69,iVar59);
      if (iVar59 != 0) {
        auVar31._4_4_ = fStack_3a4;
        auVar31._0_4_ = local_3a8;
        auVar31._8_4_ = fStack_3a0;
        auVar31._12_4_ = fStack_39c;
        auVar85 = maxps(ZEXT816(0),auVar31);
        auVar34._4_4_ = local_298[1];
        auVar34._0_4_ = local_298[0];
        auVar34._8_4_ = local_298[2];
        auVar34._12_4_ = local_298[3];
        auVar155 = minps(auVar34,_DAT_01feca10);
        auVar155 = maxps(auVar155,auVar238);
        auVar270 = minps(_local_2a8,_DAT_01feca10);
        auVar270 = maxps(auVar270,auVar238);
        local_298[0] = (auVar155._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_388 + (float)local_2c8;
        local_298[1] = (auVar155._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_388 + (float)local_2c8;
        local_298[2] = (auVar155._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_388 + (float)local_2c8;
        local_298[3] = (auVar155._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_388 + (float)local_2c8;
        local_2a8._4_4_ = (auVar270._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_388 + (float)local_2c8
        ;
        local_2a8._0_4_ =
             (auVar270._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_388 + (float)local_2c8;
        fStack_2a0 = (auVar270._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_388 + (float)local_2c8;
        fStack_29c = (auVar270._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_388 + (float)local_2c8;
        auVar142._0_4_ = fVar126 - auVar85._0_4_ * auVar85._0_4_;
        auVar142._4_4_ = fVar151 - auVar85._4_4_ * auVar85._4_4_;
        auVar142._8_4_ = fVar264 - auVar85._8_4_ * auVar85._8_4_;
        auVar142._12_4_ = fVar152 - auVar85._12_4_ * auVar85._12_4_;
        auVar293._0_4_ =
             (float)local_468._0_4_ * (float)local_468._0_4_ -
             (float)local_3b8._0_4_ * auVar142._0_4_;
        auVar293._4_4_ =
             (float)local_468._4_4_ * (float)local_468._4_4_ -
             (float)local_3b8._4_4_ * auVar142._4_4_;
        auVar293._8_4_ = fStack_460 * fStack_460 - fStack_3b0 * auVar142._8_4_;
        auVar293._12_4_ = fStack_45c * fStack_45c - fStack_3ac * auVar142._12_4_;
        local_318._4_4_ = -(uint)(0.0 <= auVar293._4_4_);
        local_318._0_4_ = -(uint)(0.0 <= auVar293._0_4_);
        local_318._8_4_ = -(uint)(0.0 <= auVar293._8_4_);
        local_318._12_4_ = -(uint)(0.0 <= auVar293._12_4_);
        iVar59 = movmskps(iVar59,local_318);
        if (iVar59 == 0) {
          fVar236 = 0.0;
          fVar239 = 0.0;
          fVar240 = 0.0;
          fVar241 = 0.0;
          fVar211 = 0.0;
          fVar212 = 0.0;
          fVar234 = 0.0;
          fVar235 = 0.0;
          fVar82 = 0.0;
          fVar124 = 0.0;
          fVar153 = 0.0;
          fVar171 = 0.0;
          fVar250 = 0.0;
          fVar251 = 0.0;
          fVar252 = 0.0;
          fVar263 = 0.0;
          _local_468 = ZEXT816(0);
          iVar59 = 0;
          auVar143 = _DAT_01feba00;
          auVar258 = _DAT_01feb9f0;
        }
        else {
          auVar155 = sqrtps(_DAT_01ff1da0,auVar293);
          auVar113._0_4_ = fVar193 + fVar193;
          auVar113._4_4_ = fVar194 + fVar194;
          auVar113._8_4_ = fVar195 + fVar195;
          auVar113._12_4_ = fVar210 + fVar210;
          auVar85 = rcpps(auVar142,auVar113);
          fVar126 = auVar85._0_4_;
          fVar151 = auVar85._4_4_;
          fVar264 = auVar85._8_4_;
          fVar152 = auVar85._12_4_;
          fVar126 = (fVar82 - auVar113._0_4_ * fVar126) * fVar126 + fVar126;
          fVar151 = (fVar124 - auVar113._4_4_ * fVar151) * fVar151 + fVar151;
          fVar264 = (fVar153 - auVar113._8_4_ * fVar264) * fVar264 + fVar264;
          fVar152 = (fVar171 - auVar113._12_4_ * fVar152) * fVar152 + fVar152;
          fVar278 = (-(float)local_468._0_4_ - auVar155._0_4_) * fVar126;
          fVar285 = (-(float)local_468._4_4_ - auVar155._4_4_) * fVar151;
          fVar286 = (-fStack_460 - auVar155._8_4_) * fVar264;
          fVar287 = (-fStack_45c - auVar155._12_4_) * fVar152;
          fVar126 = (auVar155._0_4_ - (float)local_468._0_4_) * fVar126;
          fVar151 = (auVar155._4_4_ - (float)local_468._4_4_) * fVar151;
          fVar264 = (auVar155._8_4_ - fStack_460) * fVar264;
          fVar152 = (auVar155._12_4_ - fStack_45c) * fVar152;
          fVar236 = ((float)local_2f8._0_4_ * fVar278 + fVar211) * (float)local_5a8._0_4_;
          fVar239 = ((float)local_2f8._4_4_ * fVar285 + fVar212) * (float)local_5a8._4_4_;
          fVar240 = ((float)local_2f8._8_4_ * fVar286 + fVar234) * fStack_5a0;
          fVar241 = ((float)local_2f8._12_4_ * fVar287 + fVar235) * fStack_59c;
          fVar82 = local_2d8 * fVar278 - ((float)local_2e8._0_4_ * fVar236 + fVar310);
          fVar124 = fStack_2d4 * fVar285 - ((float)local_2e8._4_4_ * fVar239 + fVar311);
          fVar153 = fStack_2d0 * fVar286 - (fStack_2e0 * fVar240 + fVar312);
          fVar171 = fStack_2cc * fVar287 - (fStack_2dc * fVar241 + fVar315);
          fVar250 = local_348 * fVar278 - ((float)local_3f8._0_4_ * fVar236 + fVar313);
          fVar251 = fStack_344 * fVar285 - ((float)local_3f8._4_4_ * fVar239 + fVar316);
          fVar252 = fStack_340 * fVar286 - (fStack_3f0 * fVar240 + fVar318);
          fVar263 = fStack_33c * fVar287 - (fStack_3ec * fVar241 + fVar319);
          local_568._4_4_ = fVar251;
          local_568._0_4_ = fVar250;
          fStack_560 = fVar252;
          fStack_55c = fVar263;
          local_468._4_4_ = fStack_3e4 * fVar285 - (fVar239 * (float)local_408._4_4_ + fStack_3d4);
          local_468._0_4_ = local_3e8 * fVar278 - (fVar236 * (float)local_408._0_4_ + local_3d8);
          fStack_460 = fStack_3e0 * fVar286 - (fVar240 * fStack_400 + fStack_3d0);
          fStack_45c = fStack_3dc * fVar287 - (fVar241 * fStack_3fc + fStack_3cc);
          fVar265 = ((float)local_2f8._0_4_ * fVar126 + fVar211) * (float)local_5a8._0_4_;
          fVar276 = ((float)local_2f8._4_4_ * fVar151 + fVar212) * (float)local_5a8._4_4_;
          fVar277 = ((float)local_2f8._8_4_ * fVar264 + fVar234) * fStack_5a0;
          fVar173 = ((float)local_2f8._12_4_ * fVar152 + fVar235) * fStack_59c;
          fVar236 = local_2d8 * fVar126 - ((float)local_2e8._0_4_ * fVar265 + fVar310);
          fVar239 = fStack_2d4 * fVar151 - ((float)local_2e8._4_4_ * fVar276 + fVar311);
          fVar240 = fStack_2d0 * fVar264 - (fStack_2e0 * fVar277 + fVar312);
          fVar241 = fStack_2cc * fVar152 - (fStack_2dc * fVar173 + fVar315);
          fVar211 = local_348 * fVar126 - ((float)local_3f8._0_4_ * fVar265 + fVar313);
          fVar212 = fStack_344 * fVar151 - ((float)local_3f8._4_4_ * fVar276 + fVar316);
          fVar234 = fStack_340 * fVar264 - (fStack_3f0 * fVar277 + fVar318);
          fVar235 = fStack_33c * fVar152 - (fStack_3ec * fVar173 + fVar319);
          bVar21 = 0.0 <= auVar293._0_4_;
          uVar77 = -(uint)bVar21;
          bVar22 = 0.0 <= auVar293._4_4_;
          uVar78 = -(uint)bVar22;
          bVar23 = 0.0 <= auVar293._8_4_;
          uVar79 = -(uint)bVar23;
          bVar24 = 0.0 <= auVar293._12_4_;
          uVar80 = -(uint)bVar24;
          auVar238._0_4_ = local_3e8 * fVar126 - (fVar265 * (float)local_408._0_4_ + local_3d8);
          auVar238._4_4_ = fStack_3e4 * fVar151 - (fVar276 * (float)local_408._4_4_ + fStack_3d4);
          auVar238._8_4_ = fStack_3e0 * fVar264 - (fVar277 * fStack_400 + fStack_3d0);
          auVar238._12_4_ = fStack_3dc * fVar152 - (fVar173 * fStack_3fc + fStack_3cc);
          auVar274._0_4_ = (uint)fVar278 & uVar77;
          auVar274._4_4_ = (uint)fVar285 & uVar78;
          auVar274._8_4_ = (uint)fVar286 & uVar79;
          auVar274._12_4_ = (uint)fVar287 & uVar80;
          auVar258._0_8_ = CONCAT44(~uVar78,~uVar77) & 0x7f8000007f800000;
          auVar258._8_4_ = ~uVar79 & 0x7f800000;
          auVar258._12_4_ = ~uVar80 & 0x7f800000;
          auVar258 = auVar258 | auVar274;
          auVar200._0_4_ = (uint)fVar126 & uVar77;
          auVar200._4_4_ = (uint)fVar151 & uVar78;
          auVar200._8_4_ = (uint)fVar264 & uVar79;
          auVar200._12_4_ = (uint)fVar152 & uVar80;
          auVar143._0_8_ = CONCAT44(~uVar78,~uVar77) & 0xff800000ff800000;
          auVar143._8_4_ = ~uVar79 & 0xff800000;
          auVar143._12_4_ = ~uVar80 & 0xff800000;
          auVar143 = auVar143 | auVar200;
          auVar114._0_8_ = CONCAT44(fStack_304,local_308) & 0x7fffffff7fffffff;
          auVar114._8_4_ = ABS(fStack_300);
          auVar114._12_4_ = ABS(fStack_2fc);
          auVar36._4_4_ = fStack_264;
          auVar36._0_4_ = local_268;
          auVar36._8_4_ = fStack_260;
          auVar36._12_4_ = fStack_25c;
          auVar85 = maxps(auVar36,auVar114);
          fVar126 = auVar85._0_4_ * 1.9073486e-06;
          fVar151 = auVar85._4_4_ * 1.9073486e-06;
          fVar264 = auVar85._8_4_ * 1.9073486e-06;
          fVar152 = auVar85._12_4_ * 1.9073486e-06;
          auVar201._0_4_ = -(uint)(ABS(fVar193) < fVar126 && bVar21);
          auVar201._4_4_ = -(uint)(ABS(fVar194) < fVar151 && bVar22);
          auVar201._8_4_ = -(uint)(ABS(fVar195) < fVar264 && bVar23);
          auVar201._12_4_ = -(uint)(ABS(fVar210) < fVar152 && bVar24);
          iVar59 = movmskps(iVar59,auVar201);
          local_558 = fVar82;
          fStack_554 = fVar124;
          fStack_550 = fVar153;
          fStack_54c = fVar171;
          _local_4d8 = auVar142;
          if (iVar59 != 0) {
            uVar77 = -(uint)(auVar142._0_4_ <= 0.0);
            uVar78 = -(uint)(auVar142._4_4_ <= 0.0);
            uVar79 = -(uint)(auVar142._8_4_ <= 0.0);
            uVar80 = -(uint)(auVar142._12_4_ <= 0.0);
            auVar283._0_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar201._0_4_;
            auVar283._4_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar201._4_4_;
            auVar283._8_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar201._8_4_;
            auVar283._12_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar201._12_4_;
            auVar275._0_4_ = ~auVar201._0_4_ & auVar258._0_4_;
            auVar275._4_4_ = ~auVar201._4_4_ & auVar258._4_4_;
            auVar275._8_4_ = ~auVar201._8_4_ & auVar258._8_4_;
            auVar275._12_4_ = ~auVar201._12_4_ & auVar258._12_4_;
            auVar258 = auVar275 | auVar283;
            auVar284._0_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar201._0_4_;
            auVar284._4_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar201._4_4_;
            auVar284._8_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar201._8_4_;
            auVar284._12_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar201._12_4_;
            auVar209._0_4_ = ~auVar201._0_4_ & auVar143._0_4_;
            auVar209._4_4_ = ~auVar201._4_4_ & auVar143._4_4_;
            auVar209._8_4_ = ~auVar201._8_4_ & auVar143._8_4_;
            auVar209._12_4_ = ~auVar201._12_4_ & auVar143._12_4_;
            auVar143 = auVar209 | auVar284;
            local_318._4_4_ = -(uint)((fVar151 <= ABS(fVar194) || auVar142._4_4_ <= 0.0) && bVar22);
            local_318._0_4_ = -(uint)((fVar126 <= ABS(fVar193) || auVar142._0_4_ <= 0.0) && bVar21);
            local_318._8_4_ = -(uint)((fVar264 <= ABS(fVar195) || auVar142._8_4_ <= 0.0) && bVar23);
            local_318._12_4_ =
                 -(uint)((fVar152 <= ABS(fVar210) || auVar142._12_4_ <= 0.0) && bVar24);
          }
        }
        fVar193 = (ray->dir).field_0.m128[0];
        fVar194 = (ray->dir).field_0.m128[1];
        fVar195 = (ray->dir).field_0.m128[2];
        local_3f8._4_4_ =
             -(uint)(0.3 <= ABS(fVar239 * fVar193 + fVar212 * fVar194 + auVar238._4_4_ * fVar195));
        local_3f8._0_4_ =
             -(uint)(0.3 <= ABS(fVar236 * fVar193 + fVar211 * fVar194 + auVar238._0_4_ * fVar195));
        fStack_3f0 = (float)-(uint)(0.3 <= ABS(fVar240 * fVar193 +
                                               fVar234 * fVar194 + auVar238._8_4_ * fVar195));
        fStack_3ec = (float)-(uint)(0.3 <= ABS(fVar241 * fVar193 +
                                               fVar235 * fVar194 + auVar238._12_4_ * fVar195));
        _local_118 = local_3c8;
        local_108 = minps(_local_578,auVar258);
        _local_248 = maxps(local_3c8,auVar143);
        local_238 = _local_578;
        local_328._0_8_ =
             CONCAT44(-(uint)(fVar83 <= local_108._4_4_) & auVar307._4_4_,
                      -(uint)(fVar172 <= local_108._0_4_) & (uint)auVar307._0_4_);
        local_328._8_4_ = -(uint)(fVar125 <= local_108._8_4_) & auVar307._8_4_;
        local_328._12_4_ = -(uint)(fVar174 <= local_108._12_4_) & auVar307._12_4_;
        _local_408 = _local_248;
        local_338._0_8_ =
             CONCAT44(-(uint)(local_248._4_4_ <= local_578._4_4_) & auVar307._4_4_,
                      -(uint)(local_248._0_4_ <= local_578._0_4_) & (uint)auVar307._0_4_);
        local_338._8_4_ = -(uint)(local_248._8_4_ <= local_578._8_4_) & auVar307._8_4_;
        local_338._12_4_ = -(uint)(local_248._12_4_ <= local_578._12_4_) & auVar307._12_4_;
        auVar183._8_4_ = local_328._8_4_;
        auVar183._0_8_ = local_328._0_8_;
        auVar183._12_4_ = local_328._12_4_;
        _local_2e8 = local_338;
        auVar144._8_4_ = local_338._8_4_;
        auVar144._0_8_ = local_338._0_8_;
        auVar144._12_4_ = local_338._12_4_;
        iVar59 = movmskps(iVar59,auVar144 | auVar183);
        lVar62 = CONCAT44(uVar69,iVar59);
        if (iVar59 != 0) {
          local_308 = local_4a0._0_4_;
          fStack_304 = local_4a0._0_4_;
          fStack_300 = local_4a0._0_4_;
          fStack_2fc = local_4a0._0_4_;
          local_468._0_4_ =
               -(uint)((int)local_4a0._0_4_ <
                      ((int)((-(uint)(0.3 <= ABS((float)local_468._0_4_ * fVar195 +
                                                 fVar250 * fVar194 + fVar82 * fVar193)) &
                             local_318._0_4_) << 0x1f) >> 0x1f) + 4);
          local_468._4_4_ =
               -(uint)((int)local_4a0._0_4_ <
                      ((int)((-(uint)(0.3 <= ABS((float)local_468._4_4_ * fVar195 +
                                                 fVar251 * fVar194 + fVar124 * fVar193)) &
                             local_318._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_460 = (float)-(uint)((int)local_4a0._0_4_ <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_460 * fVar195 +
                                                                fVar252 * fVar194 +
                                                                fVar153 * fVar193)) &
                                            local_318._8_4_) << 0x1f) >> 0x1f) + 4);
          fStack_45c = (float)-(uint)((int)local_4a0._0_4_ <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_45c * fVar195 +
                                                                fVar263 * fVar194 +
                                                                fVar171 * fVar193)) &
                                            local_318._12_4_) << 0x1f) >> 0x1f) + 4);
          local_328 = ~_local_468 & auVar183;
          iVar59 = movmskps(iVar59,local_328);
          local_2f8 = auVar183;
          if (iVar59 != 0) {
            local_3d8 = local_528 + fVar172;
            fStack_3d4 = fStack_524 + fVar83;
            fStack_3d0 = fStack_520 + fVar125;
            fStack_3cc = fStack_51c + fVar174;
            do {
              auVar155 = ~local_328 & _DAT_01feb9f0 | local_328 & local_3c8;
              auVar184._4_4_ = auVar155._0_4_;
              auVar184._0_4_ = auVar155._4_4_;
              auVar184._8_4_ = auVar155._12_4_;
              auVar184._12_4_ = auVar155._8_4_;
              auVar85 = minps(auVar184,auVar155);
              auVar145._0_8_ = auVar85._8_8_;
              auVar145._8_4_ = auVar85._0_4_;
              auVar145._12_4_ = auVar85._4_4_;
              auVar85 = minps(auVar145,auVar85);
              auVar146._0_8_ =
                   CONCAT44(-(uint)(auVar85._4_4_ == auVar155._4_4_) & local_328._4_4_,
                            -(uint)(auVar85._0_4_ == auVar155._0_4_) & local_328._0_4_);
              auVar146._8_4_ = -(uint)(auVar85._8_4_ == auVar155._8_4_) & local_328._8_4_;
              auVar146._12_4_ = -(uint)(auVar85._12_4_ == auVar155._12_4_) & local_328._12_4_;
              iVar59 = movmskps(iVar59,auVar146);
              auVar115 = local_328;
              if (iVar59 != 0) {
                auVar115._8_4_ = auVar146._8_4_;
                auVar115._0_8_ = auVar146._0_8_;
                auVar115._12_4_ = auVar146._12_4_;
              }
              uVar60 = movmskps(iVar59,auVar115);
              lVar62 = 0;
              if (CONCAT44(uVar69,uVar60) != 0) {
                for (; (CONCAT44(uVar69,uVar60) >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                }
              }
              *(undefined4 *)(local_328 + lVar62 * 4) = 0;
              fVar172 = local_298[lVar62];
              fVar82 = *(float *)(local_118 + lVar62 * 4);
              local_558 = (ray->dir).field_0.m128[0];
              fStack_554 = (ray->dir).field_0.m128[1];
              fStack_550 = (ray->dir).field_0.m128[2];
              fStack_54c = (ray->dir).field_0.m128[3];
              fVar83 = fStack_550 * fStack_550 + fStack_554 * fStack_554 + local_558 * local_558;
              if (fVar83 < 0.0) {
                fVar83 = sqrtf(fVar83);
                lVar62 = extraout_RAX;
              }
              else {
                fVar83 = SQRT(fVar83);
              }
              auVar25._4_4_ = fStack_544;
              auVar25._0_4_ = local_548;
              auVar25._8_4_ = fStack_540;
              auVar25._12_4_ = fStack_53c;
              auVar155 = minps(_local_538,auVar25);
              auVar270 = maxps(_local_538,auVar25);
              auVar27._4_4_ = fStack_454;
              auVar27._0_4_ = local_458;
              auVar27._8_4_ = fStack_450;
              auVar27._12_4_ = fStack_44c;
              auVar29._4_4_ = fStack_444;
              auVar29._0_4_ = local_448;
              auVar29._8_4_ = fStack_440;
              auVar29._12_4_ = fStack_43c;
              auVar85 = minps(auVar27,auVar29);
              auVar155 = minps(auVar155,auVar85);
              auVar85 = maxps(auVar27,auVar29);
              auVar85 = maxps(auVar270,auVar85);
              auVar202._0_8_ = auVar155._0_8_ & 0x7fffffff7fffffff;
              auVar202._8_4_ = auVar155._8_4_ & 0x7fffffff;
              auVar202._12_4_ = auVar155._12_4_ & 0x7fffffff;
              local_4d8._4_4_ = auVar85._12_4_;
              auVar116._0_8_ = auVar85._0_8_ & 0x7fffffff7fffffff;
              auVar116._8_4_ = auVar85._8_4_ & 0x7fffffff;
              auVar116._12_4_ = local_4d8._4_4_ & 0x7fffffff;
              auVar85 = maxps(auVar202,auVar116);
              fVar124 = auVar85._4_4_;
              if (auVar85._4_4_ <= auVar85._0_4_) {
                fVar124 = auVar85._0_4_;
              }
              auVar203._8_8_ = auVar85._8_8_;
              auVar203._0_8_ = auVar85._8_8_;
              if (auVar85._8_4_ <= fVar124) {
                auVar203._0_4_ = fVar124;
              }
              register0x00001304 = auVar203._4_12_;
              local_568._0_4_ = auVar203._0_4_ * 1.9073486e-06;
              local_398 = fVar83 * 1.9073486e-06;
              local_4d8._0_4_ = local_4d8._4_4_;
              fStack_4d0 = (float)local_4d8._4_4_;
              fStack_4cc = (float)local_4d8._4_4_;
              lVar74 = 5;
              do {
                auVar306._4_12_ = auVar307._4_12_;
                fVar195 = 1.0 - fVar172;
                fVar171 = local_548 * fVar195 + local_458 * fVar172;
                fVar174 = fStack_544 * fVar195 + fStack_454 * fVar172;
                fVar193 = fStack_540 * fVar195 + fStack_450 * fVar172;
                fVar194 = fStack_53c * fVar195 + fStack_44c * fVar172;
                fVar83 = ((float)local_538._0_4_ * fVar195 + local_548 * fVar172) * fVar195 +
                         fVar172 * fVar171;
                fVar124 = ((float)local_538._4_4_ * fVar195 + fStack_544 * fVar172) * fVar195 +
                          fVar172 * fVar174;
                fVar125 = (fStack_530 * fVar195 + fStack_540 * fVar172) * fVar195 +
                          fVar172 * fVar193;
                fVar153 = (fStack_52c * fVar195 + fStack_53c * fVar172) * fVar195 +
                          fVar172 * fVar194;
                fVar171 = fVar171 * fVar195 + (local_458 * fVar195 + local_448 * fVar172) * fVar172;
                fVar174 = fVar174 * fVar195 +
                          (fStack_454 * fVar195 + fStack_444 * fVar172) * fVar172;
                fVar193 = fVar193 * fVar195 +
                          (fStack_450 * fVar195 + fStack_440 * fVar172) * fVar172;
                fVar194 = fVar194 * fVar195 +
                          (fStack_44c * fVar195 + fStack_43c * fVar172) * fVar172;
                local_368._0_4_ = fVar195 * fVar83 + fVar172 * fVar171;
                local_368._4_4_ = fVar195 * fVar124 + fVar172 * fVar174;
                fStack_360 = fVar195 * fVar125 + fVar172 * fVar193;
                fStack_35c = fVar195 * fVar153 + fVar172 * fVar194;
                local_5a8._0_4_ = (fVar171 - fVar83) * 3.0;
                local_5a8._4_4_ = (fVar174 - fVar124) * 3.0;
                fStack_5a0 = (fVar193 - fVar125) * 3.0;
                fStack_59c = (fVar194 - fVar153) * 3.0;
                local_4b8._0_4_ = (fVar82 * local_558 + 0.0) - (float)local_368._0_4_;
                local_4b8._4_4_ = (fVar82 * fStack_554 + 0.0) - (float)local_368._4_4_;
                fStack_4b0 = (fVar82 * fStack_550 + 0.0) - fStack_360;
                fStack_4ac = (fVar82 * fStack_54c + 0.0) - fStack_35c;
                fVar83 = (float)local_4b8._4_4_ * (float)local_4b8._4_4_;
                fVar124 = fStack_4b0 * fStack_4b0;
                fVar125 = fStack_4ac * fStack_4ac;
                local_578._0_4_ = fVar83 + (float)local_4b8._0_4_ * (float)local_4b8._0_4_ + fVar124
                ;
                local_578._4_4_ = fVar83 + fVar83 + fVar125;
                fStack_570 = fVar83 + fVar124 + fVar124;
                fStack_56c = fVar83 + fVar125 + fVar125;
                local_388 = (float)local_578._0_4_;
                if ((float)local_578._0_4_ < 0.0) {
                  fVar83 = sqrtf((float)local_578._0_4_);
                  auVar306._4_4_ = extraout_var._0_4_;
                  auVar306._0_4_ = fVar83;
                  auVar306._8_4_ = extraout_var._4_4_;
                  auVar306._12_4_ = extraout_var._8_4_;
                  lVar62 = extraout_RAX_00;
                  fVar83 = (float)local_5a8._0_4_;
                  fVar124 = (float)local_5a8._4_4_;
                  fVar125 = fStack_5a0;
                  fVar153 = fStack_59c;
                }
                else {
                  auVar306._0_4_ = SQRT((float)local_578._0_4_);
                  fVar83 = (float)local_5a8._0_4_;
                  fVar124 = (float)local_5a8._4_4_;
                  fVar125 = fStack_5a0;
                  fVar153 = fStack_59c;
                }
                fVar194 = fVar195 * 6.0;
                fVar171 = (fVar172 - (fVar195 + fVar195)) * 6.0;
                fVar193 = (fVar195 - (fVar172 + fVar172)) * 6.0;
                fVar174 = fVar172 * 6.0;
                fVar195 = fVar194 * (float)local_538._0_4_ +
                          fVar171 * local_548 + fVar193 * local_458 + fVar174 * local_448;
                fVar210 = fVar194 * (float)local_538._4_4_ +
                          fVar171 * fStack_544 + fVar193 * fStack_454 + fVar174 * fStack_444;
                fVar211 = fVar194 * fStack_530 +
                          fVar171 * fStack_540 + fVar193 * fStack_450 + fVar174 * fStack_440;
                local_4c8 = (float)local_568._0_4_;
                if ((float)local_568._0_4_ <= local_398 * fVar82) {
                  local_4c8 = local_398 * fVar82;
                }
                fVar212 = fVar124 * fVar124 + fVar83 * fVar83 + fVar125 * fVar125;
                auVar155 = ZEXT416((uint)fVar212);
                auVar85 = rsqrtss(ZEXT416((uint)fVar212),auVar155);
                fVar234 = auVar85._0_4_;
                fStack_50c = fVar234 * fVar234 * fVar212 * -0.5 * fVar234 + fVar234 * 1.5;
                fVar234 = fVar125 * fVar211 + fVar124 * fVar210 + fVar83 * fVar195;
                auVar85 = rcpss(auVar155,auVar155);
                fVar241 = (2.0 - fVar212 * auVar85._0_4_) * auVar85._0_4_;
                fVar235 = fVar83 * fStack_50c;
                fVar236 = fVar124 * fStack_50c;
                fVar239 = fVar125 * fStack_50c;
                fVar240 = fVar153 * fStack_50c;
                local_518 = fVar241 * (fVar212 * fVar195 - fVar234 * fVar83) * fStack_50c;
                fStack_514 = fVar241 * (fVar212 * fVar210 - fVar234 * fVar124) * fStack_50c;
                fStack_510 = fVar241 * (fVar212 * fVar211 - fVar234 * fVar125) * fStack_50c;
                fStack_50c = fVar241 * (fVar212 * (fVar194 * fStack_52c +
                                                  fVar171 * fStack_53c +
                                                  fVar193 * fStack_44c + fVar174 * fStack_43c) -
                                       fVar234 * fVar153) * fStack_50c;
                fStack_4c4 = (float)local_568._4_4_;
                fStack_4c0 = fStack_560;
                uStack_4bc = fStack_55c;
                if (fVar212 < 0.0) {
                  local_4f8 = auVar306._0_4_;
                  local_508 = -fVar83;
                  fStack_504 = -fVar124;
                  fStack_500 = -fVar125;
                  fStack_4fc = -fVar153;
                  fVar212 = sqrtf(fVar212);
                  auVar306 = ZEXT416((uint)local_4f8);
                  lVar62 = extraout_RAX_01;
                  fVar83 = local_508;
                  fVar124 = fStack_504;
                  fVar125 = fStack_500;
                  fVar153 = fStack_4fc;
                }
                else {
                  fVar212 = SQRT(fVar212);
                  fVar83 = -fVar83;
                  fVar124 = -fVar124;
                  fVar125 = -fVar125;
                  fVar153 = -fVar153;
                }
                fVar171 = (float)local_4b8._4_4_ * fVar236;
                fVar195 = fStack_4b0 * fVar239;
                fStack_50c = fStack_4ac * fVar240;
                fVar211 = fVar171 + (float)local_4b8._0_4_ * fVar235 + fVar195;
                fVar234 = fVar171 + fVar171 + fStack_50c;
                fVar195 = fVar171 + fVar195 + fVar195;
                fStack_50c = fVar171 + fStack_50c + fStack_50c;
                auVar307._0_4_ =
                     (auVar306._0_4_ + 1.0) * ((float)local_568._0_4_ / fVar212) +
                     auVar306._0_4_ * (float)local_568._0_4_ + local_4c8;
                auVar307._4_12_ = auVar306._4_12_;
                fVar174 = fStack_54c * fVar240;
                fVar210 = fVar239 * fVar125 + fVar236 * fVar124 + fVar235 * fVar83 +
                          fStack_510 * fStack_4b0 +
                          fStack_514 * (float)local_4b8._4_4_ + local_518 * (float)local_4b8._0_4_;
                fVar171 = fStack_550 * fVar239 + fStack_554 * fVar236 + local_558 * fVar235;
                fVar194 = local_578._0_4_ - fVar211 * fVar211;
                auVar117._0_8_ = CONCAT44(local_578._4_4_ - fVar234 * fVar234,fVar194);
                auVar117._8_4_ = local_578._8_4_ - fVar195 * fVar195;
                auVar117._12_4_ = local_578._12_4_ - fStack_50c * fStack_50c;
                fVar193 = fVar153 * fStack_4ac;
                fVar83 = (fVar125 * fStack_4b0 +
                         fVar124 * (float)local_4b8._4_4_ + fVar83 * (float)local_4b8._0_4_) -
                         fVar211 * fVar210;
                local_378 = (fStack_550 * fStack_4b0 +
                            fStack_554 * (float)local_4b8._4_4_ + local_558 * (float)local_4b8._0_4_
                            ) - fVar211 * fVar171;
                fStack_374 = fStack_54c * fStack_4ac;
                fStack_370 = fStack_550 * fStack_4b0;
                fStack_36c = fStack_54c * fStack_4ac;
                auVar185._8_4_ = auVar117._8_4_;
                auVar185._0_8_ = auVar117._0_8_;
                auVar185._12_4_ = auVar117._12_4_;
                auVar85 = rsqrtss(auVar185,auVar117);
                fVar124 = auVar85._0_4_;
                auVar186._4_12_ = auVar85._4_12_;
                auVar186._0_4_ = fVar124 * fVar124 * fVar194 * -0.5 * fVar124 + fVar124 * 1.5;
                local_518 = fVar211;
                fStack_514 = fVar234;
                fStack_510 = fVar195;
                if (fVar194 < 0.0) {
                  local_508 = fVar83;
                  fStack_504 = fVar193;
                  fStack_500 = fVar125 * fStack_4b0;
                  fStack_4fc = fVar193;
                  local_4f8 = auVar307._0_4_;
                  _local_3b8 = auVar186;
                  local_3a8 = fVar171;
                  fStack_3a4 = fVar174;
                  fStack_3a0 = fStack_550 * fVar239;
                  fStack_39c = fVar174;
                  fVar194 = sqrtf(fVar194);
                  auVar307 = ZEXT416((uint)local_4f8);
                  lVar62 = extraout_RAX_02;
                  auVar186 = _local_3b8;
                  fVar171 = local_3a8;
                  fVar174 = fStack_3a4;
                  fVar83 = local_508;
                  fVar193 = fStack_504;
                }
                else {
                  fVar194 = SQRT(fVar194);
                }
                fVar194 = fVar194 - fStack_35c;
                fVar83 = fVar83 * auVar186._0_4_ - fStack_59c;
                auVar32._4_4_ = fStack_374;
                auVar32._0_4_ = local_378;
                auVar32._8_4_ = fStack_370;
                auVar32._12_4_ = fStack_36c;
                auVar161._4_12_ = auVar32._4_12_;
                auVar161._0_4_ = local_378 * auVar186._0_4_;
                auVar260._0_8_ = CONCAT44(fVar193,fVar83) ^ 0x8000000080000000;
                auVar260._8_4_ = -fVar193;
                auVar260._12_4_ = fVar240 * fVar153;
                auVar259._8_8_ = auVar260._8_8_;
                auVar259._0_8_ = CONCAT44(fVar210,fVar83) ^ 0x80000000;
                auVar187._0_4_ = fVar210 * auVar161._0_4_ - fVar171 * fVar83;
                auVar163._0_8_ = auVar161._0_8_;
                auVar163._8_4_ = fStack_374;
                auVar163._12_4_ = -fVar174;
                auVar162._8_8_ = auVar163._8_8_;
                auVar162._0_8_ = CONCAT44(fVar171,auVar161._0_4_) ^ 0x8000000000000000;
                auVar187._4_4_ = auVar187._0_4_;
                auVar187._8_4_ = auVar187._0_4_;
                auVar187._12_4_ = auVar187._0_4_;
                auVar85 = divps(auVar162,auVar187);
                auVar155 = divps(auVar259,auVar187);
                fVar172 = fVar172 - (auVar85._4_4_ * fVar194 + auVar85._0_4_ * local_518);
                fVar82 = fVar82 - (auVar155._4_4_ * fVar194 + auVar155._0_4_ * local_518);
                lVar62 = CONCAT71((int7)((ulong)lVar62 >> 8),1);
                if ((ABS(local_518) < auVar307._0_4_) &&
                   (ABS(fVar194) <
                    (float)local_4d8._0_4_ * 1.9073486e-06 + local_4c8 + auVar307._0_4_)) {
                  fVar82 = fVar82 + (float)local_2b8._0_4_;
                  lVar62 = 0;
                  if (fVar82 < (ray->org).field_0.m128[3]) {
                    uVar76 = 0;
                  }
                  else {
                    fVar83 = ray->tfar;
                    if (fVar83 < fVar82) {
                      uVar76 = 0;
                    }
                    else {
                      if ((0.0 <= fVar172) && (fVar172 <= 1.0)) {
                        auVar85 = rsqrtss(_local_578,_local_578);
                        fVar124 = auVar85._0_4_;
                        pGVar17 = (context->scene->geometries).items[(long)local_4e0].ptr;
                        pRVar63 = local_4e0;
                        if ((pGVar17->mask & ray->mask) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            uVar76 = 1;
                          }
                          else {
                            fVar124 = fVar124 * 1.5 + fVar124 * fVar124 * local_388 * -0.5 * fVar124
                            ;
                            fVar174 = (float)local_4b8._0_4_ * fVar124;
                            fVar194 = (float)local_4b8._4_4_ * fVar124;
                            fVar124 = fStack_4b0 * fVar124;
                            fVar125 = fStack_59c * fVar174 + (float)local_5a8._0_4_;
                            fVar153 = fStack_59c * fVar194 + (float)local_5a8._4_4_;
                            fVar171 = fStack_59c * fVar124 + fStack_5a0;
                            fVar193 = fVar194 * (float)local_5a8._0_4_ -
                                      (float)local_5a8._4_4_ * fVar174;
                            fVar194 = fVar124 * (float)local_5a8._4_4_ - fStack_5a0 * fVar194;
                            fVar124 = fVar174 * fStack_5a0 - (float)local_5a8._0_4_ * fVar124;
                            local_438._4_4_ = fVar125 * fVar193 - fVar194 * fVar171;
                            local_438._0_4_ = fVar171 * fVar124 - fVar193 * fVar153;
                            local_438._8_4_ = fVar153 * fVar194 - fVar124 * fVar125;
                            fStack_42c = fVar172;
                            local_428 = 0;
                            local_424 = (int)local_358;
                            local_420 = (int)local_4e0;
                            local_41c = context->user->instID[0];
                            pRVar63 = (RTCIntersectArguments *)(ulong)local_41c;
                            local_418 = context->user->instPrimID[0];
                            ray->tfar = fVar82;
                            local_5ac = 0xffffffff;
                            local_498.geometryUserPtr = pGVar17->userPtr;
                            local_498.valid = &local_5ac;
                            local_498.context = context->user;
                            local_498.hit = (RTCHitN *)local_438;
                            local_498.N = 1;
                            local_498.ray = (RTCRayN *)ray;
                            if (pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00bfe6c2:
                              pRVar63 = context->args;
                              if (pRVar63->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar63->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar17->field_8).field_0x2 & 0x40) != 0)) {
                                  pRVar71 = &local_498;
                                  (*pRVar63->filter)(pRVar71);
                                }
                                if (*local_498.valid == 0) goto LAB_00bfe71f;
                              }
                              uVar76 = 1;
                            }
                            else {
                              pRVar71 = &local_498;
                              (*pGVar17->occlusionFilterN)(pRVar71);
                              if (*local_498.valid != 0) goto LAB_00bfe6c2;
LAB_00bfe71f:
                              uVar76 = 0;
                            }
                            if ((char)uVar76 == '\0') {
                              ray->tfar = fVar83;
                            }
                          }
                          lVar62 = 0;
                          goto LAB_00bfe52e;
                        }
                      }
                      lVar62 = 0;
                      uVar76 = 0;
                    }
                  }
                }
LAB_00bfe52e:
                bVar75 = (byte)uVar76;
                if ((char)lVar62 == '\0') goto LAB_00bfe739;
                lVar74 = lVar74 + -1;
              } while (lVar74 != 0);
              bVar75 = 0;
LAB_00bfe739:
              uVar76 = (ulong)(bVar75 & 1);
              fVar172 = ray->tfar;
              local_328._0_4_ = -(uint)(local_3d8 <= fVar172) & local_328._0_4_;
              local_328._4_4_ = -(uint)(fStack_3d4 <= fVar172) & local_328._4_4_;
              local_328._8_4_ = -(uint)(fStack_3d0 <= fVar172) & local_328._8_4_;
              local_328._12_4_ = -(uint)(fStack_3cc <= fVar172) & local_328._12_4_;
              bVar64 = bVar64 | bVar75 & 1;
              uVar69 = (undefined4)((ulong)lVar62 >> 0x20);
              iVar59 = movmskps((int)lVar62,local_328);
            } while (iVar59 != 0);
          }
          fVar172 = ray->tfar;
          local_408._0_4_ = -(uint)((float)local_408._0_4_ + local_528 <= fVar172) & local_2e8._0_4_
          ;
          local_408._4_4_ =
               -(uint)((float)local_408._4_4_ + fStack_524 <= fVar172) & local_2e8._4_4_;
          fStack_400 = (float)(-(uint)(fStack_400 + fStack_520 <= fVar172) & (uint)fStack_2e0);
          fStack_3fc = (float)(-(uint)(fStack_3fc + fStack_51c <= fVar172) & (uint)fStack_2dc);
          local_3f8._0_4_ =
               -(uint)((int)local_308 <
                      ((int)((local_3f8._0_4_ & local_318._0_4_) << 0x1f) >> 0x1f) + 4);
          local_3f8._4_4_ =
               -(uint)((int)fStack_304 <
                      ((int)((local_3f8._4_4_ & local_318._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_3f0 = (float)-(uint)((int)fStack_300 <
                                     ((int)(((uint)fStack_3f0 & local_318._8_4_) << 0x1f) >> 0x1f) +
                                     4);
          fStack_3ec = (float)-(uint)((int)fStack_2fc <
                                     ((int)(((uint)fStack_3ec & local_318._12_4_) << 0x1f) >> 0x1f)
                                     + 4);
          local_338 = ~_local_3f8 & _local_408;
          iVar59 = movmskps(0,local_338);
          if (iVar59 != 0) {
            local_3c8 = _local_248;
            local_3d8 = local_528 + (float)local_248._0_4_;
            fStack_3d4 = fStack_524 + (float)local_248._4_4_;
            fStack_3d0 = fStack_520 + fStack_240;
            fStack_3cc = fStack_51c + fStack_23c;
            do {
              auVar155 = ~local_338 & _DAT_01feb9f0 | local_338 & local_3c8;
              auVar188._4_4_ = auVar155._0_4_;
              auVar188._0_4_ = auVar155._4_4_;
              auVar188._8_4_ = auVar155._12_4_;
              auVar188._12_4_ = auVar155._8_4_;
              auVar85 = minps(auVar188,auVar155);
              auVar147._0_8_ = auVar85._8_8_;
              auVar147._8_4_ = auVar85._0_4_;
              auVar147._12_4_ = auVar85._4_4_;
              auVar85 = minps(auVar147,auVar85);
              auVar148._0_8_ =
                   CONCAT44(-(uint)(auVar85._4_4_ == auVar155._4_4_) & local_338._4_4_,
                            -(uint)(auVar85._0_4_ == auVar155._0_4_) & local_338._0_4_);
              auVar148._8_4_ = -(uint)(auVar85._8_4_ == auVar155._8_4_) & local_338._8_4_;
              auVar148._12_4_ = -(uint)(auVar85._12_4_ == auVar155._12_4_) & local_338._12_4_;
              iVar59 = movmskps(iVar59,auVar148);
              auVar118 = local_338;
              if (iVar59 != 0) {
                auVar118._8_4_ = auVar148._8_4_;
                auVar118._0_8_ = auVar148._0_8_;
                auVar118._12_4_ = auVar148._12_4_;
              }
              uVar60 = movmskps(iVar59,auVar118);
              lVar62 = 0;
              if (CONCAT44(uVar69,uVar60) != 0) {
                for (; (CONCAT44(uVar69,uVar60) >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                }
              }
              *(undefined4 *)(local_338 + lVar62 * 4) = 0;
              fVar172 = local_298[lVar62 + -4];
              fVar82 = *(float *)(local_238 + lVar62 * 4);
              local_558 = (ray->dir).field_0.m128[0];
              fStack_554 = (ray->dir).field_0.m128[1];
              fStack_550 = (ray->dir).field_0.m128[2];
              fStack_54c = (ray->dir).field_0.m128[3];
              fVar83 = fStack_550 * fStack_550 + fStack_554 * fStack_554 + local_558 * local_558;
              if (fVar83 < 0.0) {
                fVar83 = sqrtf(fVar83);
                lVar62 = extraout_RAX_03;
              }
              else {
                fVar83 = SQRT(fVar83);
              }
              auVar26._4_4_ = fStack_544;
              auVar26._0_4_ = local_548;
              auVar26._8_4_ = fStack_540;
              auVar26._12_4_ = fStack_53c;
              auVar155 = minps(_local_538,auVar26);
              auVar270 = maxps(_local_538,auVar26);
              auVar28._4_4_ = fStack_454;
              auVar28._0_4_ = local_458;
              auVar28._8_4_ = fStack_450;
              auVar28._12_4_ = fStack_44c;
              auVar30._4_4_ = fStack_444;
              auVar30._0_4_ = local_448;
              auVar30._8_4_ = fStack_440;
              auVar30._12_4_ = fStack_43c;
              auVar85 = minps(auVar28,auVar30);
              auVar155 = minps(auVar155,auVar85);
              auVar85 = maxps(auVar28,auVar30);
              auVar85 = maxps(auVar270,auVar85);
              auVar204._0_8_ = auVar155._0_8_ & 0x7fffffff7fffffff;
              auVar204._8_4_ = auVar155._8_4_ & 0x7fffffff;
              auVar204._12_4_ = auVar155._12_4_ & 0x7fffffff;
              local_4d8._4_4_ = auVar85._12_4_;
              auVar119._0_8_ = auVar85._0_8_ & 0x7fffffff7fffffff;
              auVar119._8_4_ = auVar85._8_4_ & 0x7fffffff;
              auVar119._12_4_ = local_4d8._4_4_ & 0x7fffffff;
              auVar85 = maxps(auVar204,auVar119);
              fVar124 = auVar85._4_4_;
              if (auVar85._4_4_ <= auVar85._0_4_) {
                fVar124 = auVar85._0_4_;
              }
              auVar205._8_8_ = auVar85._8_8_;
              auVar205._0_8_ = auVar85._8_8_;
              if (auVar85._8_4_ <= fVar124) {
                auVar205._0_4_ = fVar124;
              }
              register0x00001304 = auVar205._4_12_;
              local_568._0_4_ = auVar205._0_4_ * 1.9073486e-06;
              local_398 = fVar83 * 1.9073486e-06;
              local_4d8._0_4_ = local_4d8._4_4_;
              fStack_4d0 = (float)local_4d8._4_4_;
              fStack_4cc = (float)local_4d8._4_4_;
              lVar74 = 5;
              do {
                auVar308._4_12_ = auVar307._4_12_;
                fVar195 = 1.0 - fVar172;
                fVar171 = local_548 * fVar195 + local_458 * fVar172;
                fVar174 = fStack_544 * fVar195 + fStack_454 * fVar172;
                fVar193 = fStack_540 * fVar195 + fStack_450 * fVar172;
                fVar194 = fStack_53c * fVar195 + fStack_44c * fVar172;
                fVar83 = ((float)local_538._0_4_ * fVar195 + local_548 * fVar172) * fVar195 +
                         fVar172 * fVar171;
                fVar124 = ((float)local_538._4_4_ * fVar195 + fStack_544 * fVar172) * fVar195 +
                          fVar172 * fVar174;
                fVar125 = (fStack_530 * fVar195 + fStack_540 * fVar172) * fVar195 +
                          fVar172 * fVar193;
                fVar153 = (fStack_52c * fVar195 + fStack_53c * fVar172) * fVar195 +
                          fVar172 * fVar194;
                fVar171 = fVar171 * fVar195 + (local_458 * fVar195 + local_448 * fVar172) * fVar172;
                fVar174 = fVar174 * fVar195 +
                          (fStack_454 * fVar195 + fStack_444 * fVar172) * fVar172;
                fVar193 = fVar193 * fVar195 +
                          (fStack_450 * fVar195 + fStack_440 * fVar172) * fVar172;
                fVar194 = fVar194 * fVar195 +
                          (fStack_44c * fVar195 + fStack_43c * fVar172) * fVar172;
                local_368._0_4_ = fVar195 * fVar83 + fVar172 * fVar171;
                local_368._4_4_ = fVar195 * fVar124 + fVar172 * fVar174;
                fStack_360 = fVar195 * fVar125 + fVar172 * fVar193;
                fStack_35c = fVar195 * fVar153 + fVar172 * fVar194;
                local_5a8._0_4_ = (fVar171 - fVar83) * 3.0;
                local_5a8._4_4_ = (fVar174 - fVar124) * 3.0;
                fStack_5a0 = (fVar193 - fVar125) * 3.0;
                fStack_59c = (fVar194 - fVar153) * 3.0;
                local_4b8._0_4_ = (fVar82 * local_558 + 0.0) - (float)local_368._0_4_;
                local_4b8._4_4_ = (fVar82 * fStack_554 + 0.0) - (float)local_368._4_4_;
                fStack_4b0 = (fVar82 * fStack_550 + 0.0) - fStack_360;
                fStack_4ac = (fVar82 * fStack_54c + 0.0) - fStack_35c;
                fVar83 = (float)local_4b8._4_4_ * (float)local_4b8._4_4_;
                fVar124 = fStack_4b0 * fStack_4b0;
                fVar125 = fStack_4ac * fStack_4ac;
                local_578._0_4_ = fVar83 + (float)local_4b8._0_4_ * (float)local_4b8._0_4_ + fVar124
                ;
                local_578._4_4_ = fVar83 + fVar83 + fVar125;
                fStack_570 = fVar83 + fVar124 + fVar124;
                fStack_56c = fVar83 + fVar125 + fVar125;
                local_388 = (float)local_578._0_4_;
                if ((float)local_578._0_4_ < 0.0) {
                  fVar83 = sqrtf((float)local_578._0_4_);
                  auVar308._4_4_ = extraout_var_00._0_4_;
                  auVar308._0_4_ = fVar83;
                  auVar308._8_4_ = extraout_var_00._4_4_;
                  auVar308._12_4_ = extraout_var_00._8_4_;
                  lVar62 = extraout_RAX_04;
                  fVar83 = (float)local_5a8._0_4_;
                  fVar124 = (float)local_5a8._4_4_;
                  fVar125 = fStack_5a0;
                  fVar153 = fStack_59c;
                }
                else {
                  auVar308._0_4_ = SQRT((float)local_578._0_4_);
                  fVar83 = (float)local_5a8._0_4_;
                  fVar124 = (float)local_5a8._4_4_;
                  fVar125 = fStack_5a0;
                  fVar153 = fStack_59c;
                }
                fVar194 = fVar195 * 6.0;
                fVar171 = (fVar172 - (fVar195 + fVar195)) * 6.0;
                fVar193 = (fVar195 - (fVar172 + fVar172)) * 6.0;
                fVar174 = fVar172 * 6.0;
                fVar195 = fVar194 * (float)local_538._0_4_ +
                          fVar171 * local_548 + fVar193 * local_458 + fVar174 * local_448;
                fVar210 = fVar194 * (float)local_538._4_4_ +
                          fVar171 * fStack_544 + fVar193 * fStack_454 + fVar174 * fStack_444;
                fVar211 = fVar194 * fStack_530 +
                          fVar171 * fStack_540 + fVar193 * fStack_450 + fVar174 * fStack_440;
                local_4c8 = (float)local_568._0_4_;
                if ((float)local_568._0_4_ <= local_398 * fVar82) {
                  local_4c8 = local_398 * fVar82;
                }
                fVar212 = fVar124 * fVar124 + fVar83 * fVar83 + fVar125 * fVar125;
                auVar155 = ZEXT416((uint)fVar212);
                auVar85 = rsqrtss(ZEXT416((uint)fVar212),auVar155);
                fVar234 = auVar85._0_4_;
                fStack_50c = fVar234 * fVar234 * fVar212 * -0.5 * fVar234 + fVar234 * 1.5;
                fVar234 = fVar125 * fVar211 + fVar124 * fVar210 + fVar83 * fVar195;
                auVar85 = rcpss(auVar155,auVar155);
                fVar241 = (2.0 - fVar212 * auVar85._0_4_) * auVar85._0_4_;
                fVar235 = fVar83 * fStack_50c;
                fVar236 = fVar124 * fStack_50c;
                fVar239 = fVar125 * fStack_50c;
                fVar240 = fVar153 * fStack_50c;
                local_518 = fVar241 * (fVar212 * fVar195 - fVar234 * fVar83) * fStack_50c;
                fStack_514 = fVar241 * (fVar212 * fVar210 - fVar234 * fVar124) * fStack_50c;
                fStack_510 = fVar241 * (fVar212 * fVar211 - fVar234 * fVar125) * fStack_50c;
                fStack_50c = fVar241 * (fVar212 * (fVar194 * fStack_52c +
                                                  fVar171 * fStack_53c +
                                                  fVar193 * fStack_44c + fVar174 * fStack_43c) -
                                       fVar234 * fVar153) * fStack_50c;
                fStack_4c4 = (float)local_568._4_4_;
                fStack_4c0 = fStack_560;
                uStack_4bc = fStack_55c;
                if (fVar212 < 0.0) {
                  local_4f8 = auVar308._0_4_;
                  local_508 = -fVar83;
                  fStack_504 = -fVar124;
                  fStack_500 = -fVar125;
                  fStack_4fc = -fVar153;
                  fVar212 = sqrtf(fVar212);
                  auVar308 = ZEXT416((uint)local_4f8);
                  lVar62 = extraout_RAX_05;
                  fVar83 = local_508;
                  fVar124 = fStack_504;
                  fVar125 = fStack_500;
                  fVar153 = fStack_4fc;
                }
                else {
                  fVar212 = SQRT(fVar212);
                  fVar83 = -fVar83;
                  fVar124 = -fVar124;
                  fVar125 = -fVar125;
                  fVar153 = -fVar153;
                }
                fVar171 = (float)local_4b8._4_4_ * fVar236;
                fVar195 = fStack_4b0 * fVar239;
                fStack_50c = fStack_4ac * fVar240;
                fVar211 = fVar171 + (float)local_4b8._0_4_ * fVar235 + fVar195;
                fVar234 = fVar171 + fVar171 + fStack_50c;
                fVar195 = fVar171 + fVar195 + fVar195;
                fStack_50c = fVar171 + fStack_50c + fStack_50c;
                auVar307._0_4_ =
                     (auVar308._0_4_ + 1.0) * ((float)local_568._0_4_ / fVar212) +
                     auVar308._0_4_ * (float)local_568._0_4_ + local_4c8;
                auVar307._4_12_ = auVar308._4_12_;
                fVar174 = fStack_54c * fVar240;
                fVar210 = fVar239 * fVar125 + fVar236 * fVar124 + fVar235 * fVar83 +
                          fStack_510 * fStack_4b0 +
                          fStack_514 * (float)local_4b8._4_4_ + local_518 * (float)local_4b8._0_4_;
                fVar171 = fStack_550 * fVar239 + fStack_554 * fVar236 + local_558 * fVar235;
                fVar194 = local_578._0_4_ - fVar211 * fVar211;
                auVar120._0_8_ = CONCAT44(local_578._4_4_ - fVar234 * fVar234,fVar194);
                auVar120._8_4_ = local_578._8_4_ - fVar195 * fVar195;
                auVar120._12_4_ = local_578._12_4_ - fStack_50c * fStack_50c;
                fVar193 = fVar153 * fStack_4ac;
                fVar83 = (fVar125 * fStack_4b0 +
                         fVar124 * (float)local_4b8._4_4_ + fVar83 * (float)local_4b8._0_4_) -
                         fVar211 * fVar210;
                local_378 = (fStack_550 * fStack_4b0 +
                            fStack_554 * (float)local_4b8._4_4_ + local_558 * (float)local_4b8._0_4_
                            ) - fVar211 * fVar171;
                fStack_374 = fStack_54c * fStack_4ac;
                fStack_370 = fStack_550 * fStack_4b0;
                fStack_36c = fStack_54c * fStack_4ac;
                auVar189._8_4_ = auVar120._8_4_;
                auVar189._0_8_ = auVar120._0_8_;
                auVar189._12_4_ = auVar120._12_4_;
                auVar85 = rsqrtss(auVar189,auVar120);
                fVar124 = auVar85._0_4_;
                auVar190._4_12_ = auVar85._4_12_;
                auVar190._0_4_ = fVar124 * fVar124 * fVar194 * -0.5 * fVar124 + fVar124 * 1.5;
                local_518 = fVar211;
                fStack_514 = fVar234;
                fStack_510 = fVar195;
                if (fVar194 < 0.0) {
                  local_508 = fVar83;
                  fStack_504 = fVar193;
                  fStack_500 = fVar125 * fStack_4b0;
                  fStack_4fc = fVar193;
                  local_4f8 = auVar307._0_4_;
                  _local_3b8 = auVar190;
                  local_3a8 = fVar171;
                  fStack_3a4 = fVar174;
                  fStack_3a0 = fStack_550 * fVar239;
                  fStack_39c = fVar174;
                  fVar194 = sqrtf(fVar194);
                  auVar307 = ZEXT416((uint)local_4f8);
                  lVar62 = extraout_RAX_06;
                  auVar190 = _local_3b8;
                  fVar171 = local_3a8;
                  fVar174 = fStack_3a4;
                  fVar83 = local_508;
                  fVar193 = fStack_504;
                }
                else {
                  fVar194 = SQRT(fVar194);
                }
                fVar194 = fVar194 - fStack_35c;
                fVar83 = fVar83 * auVar190._0_4_ - fStack_59c;
                auVar33._4_4_ = fStack_374;
                auVar33._0_4_ = local_378;
                auVar33._8_4_ = fStack_370;
                auVar33._12_4_ = fStack_36c;
                auVar164._4_12_ = auVar33._4_12_;
                auVar164._0_4_ = local_378 * auVar190._0_4_;
                auVar262._0_8_ = CONCAT44(fVar193,fVar83) ^ 0x8000000080000000;
                auVar262._8_4_ = -fVar193;
                auVar262._12_4_ = fVar240 * fVar153;
                auVar261._8_8_ = auVar262._8_8_;
                auVar261._0_8_ = CONCAT44(fVar210,fVar83) ^ 0x80000000;
                auVar191._0_4_ = fVar210 * auVar164._0_4_ - fVar171 * fVar83;
                auVar166._0_8_ = auVar164._0_8_;
                auVar166._8_4_ = fStack_374;
                auVar166._12_4_ = -fVar174;
                auVar165._8_8_ = auVar166._8_8_;
                auVar165._0_8_ = CONCAT44(fVar171,auVar164._0_4_) ^ 0x8000000000000000;
                auVar191._4_4_ = auVar191._0_4_;
                auVar191._8_4_ = auVar191._0_4_;
                auVar191._12_4_ = auVar191._0_4_;
                auVar85 = divps(auVar165,auVar191);
                auVar155 = divps(auVar261,auVar191);
                fVar172 = fVar172 - (auVar85._4_4_ * fVar194 + auVar85._0_4_ * local_518);
                fVar82 = fVar82 - (auVar155._4_4_ * fVar194 + auVar155._0_4_ * local_518);
                lVar62 = CONCAT71((int7)((ulong)lVar62 >> 8),1);
                if ((ABS(local_518) < auVar307._0_4_) &&
                   (ABS(fVar194) <
                    (float)local_4d8._0_4_ * 1.9073486e-06 + local_4c8 + auVar307._0_4_)) {
                  fVar82 = fVar82 + (float)local_2b8._0_4_;
                  lVar62 = 0;
                  if (fVar82 < (ray->org).field_0.m128[3]) {
                    uVar76 = 0;
                  }
                  else {
                    fVar83 = ray->tfar;
                    if (fVar83 < fVar82) {
                      uVar76 = 0;
                    }
                    else {
                      if ((0.0 <= fVar172) && (fVar172 <= 1.0)) {
                        auVar85 = rsqrtss(_local_578,_local_578);
                        fVar124 = auVar85._0_4_;
                        pGVar17 = (context->scene->geometries).items[(long)local_4e0].ptr;
                        pRVar63 = local_4e0;
                        if ((pGVar17->mask & ray->mask) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            uVar76 = 1;
                          }
                          else {
                            fVar124 = fVar124 * 1.5 + fVar124 * fVar124 * local_388 * -0.5 * fVar124
                            ;
                            fVar174 = (float)local_4b8._0_4_ * fVar124;
                            fVar194 = (float)local_4b8._4_4_ * fVar124;
                            fVar124 = fStack_4b0 * fVar124;
                            fVar125 = fStack_59c * fVar174 + (float)local_5a8._0_4_;
                            fVar153 = fStack_59c * fVar194 + (float)local_5a8._4_4_;
                            fVar171 = fStack_59c * fVar124 + fStack_5a0;
                            fVar193 = fVar194 * (float)local_5a8._0_4_ -
                                      (float)local_5a8._4_4_ * fVar174;
                            fVar194 = fVar124 * (float)local_5a8._4_4_ - fStack_5a0 * fVar194;
                            fVar124 = fVar174 * fStack_5a0 - (float)local_5a8._0_4_ * fVar124;
                            local_438._4_4_ = fVar125 * fVar193 - fVar194 * fVar171;
                            local_438._0_4_ = fVar171 * fVar124 - fVar193 * fVar153;
                            local_438._8_4_ = fVar153 * fVar194 - fVar124 * fVar125;
                            fStack_42c = fVar172;
                            local_428 = 0;
                            local_424 = (int)local_358;
                            local_420 = (int)local_4e0;
                            local_41c = context->user->instID[0];
                            pRVar63 = (RTCIntersectArguments *)(ulong)local_41c;
                            local_418 = context->user->instPrimID[0];
                            ray->tfar = fVar82;
                            local_5ac = 0xffffffff;
                            local_498.geometryUserPtr = pGVar17->userPtr;
                            local_498.valid = &local_5ac;
                            local_498.context = context->user;
                            local_498.hit = (RTCHitN *)local_438;
                            local_498.N = 1;
                            local_498.ray = (RTCRayN *)ray;
                            if (pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00bff17b:
                              pRVar63 = context->args;
                              if (pRVar63->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar63->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar17->field_8).field_0x2 & 0x40) != 0)) {
                                  pRVar71 = &local_498;
                                  (*pRVar63->filter)(pRVar71);
                                }
                                if (*local_498.valid == 0) goto LAB_00bff1d8;
                              }
                              uVar76 = 1;
                            }
                            else {
                              pRVar71 = &local_498;
                              (*pGVar17->occlusionFilterN)(pRVar71);
                              if (*local_498.valid != 0) goto LAB_00bff17b;
LAB_00bff1d8:
                              uVar76 = 0;
                            }
                            if ((char)uVar76 == '\0') {
                              ray->tfar = fVar83;
                            }
                          }
                          lVar62 = 0;
                          goto LAB_00bfefe7;
                        }
                      }
                      lVar62 = 0;
                      uVar76 = 0;
                    }
                  }
                }
LAB_00bfefe7:
                bVar75 = (byte)uVar76;
                if ((char)lVar62 == '\0') goto LAB_00bff1f2;
                lVar74 = lVar74 + -1;
              } while (lVar74 != 0);
              bVar75 = 0;
LAB_00bff1f2:
              uVar76 = (ulong)(bVar75 & 1);
              fVar172 = ray->tfar;
              local_338._0_4_ = -(uint)(local_3d8 <= fVar172) & local_338._0_4_;
              local_338._4_4_ = -(uint)(fStack_3d4 <= fVar172) & local_338._4_4_;
              local_338._8_4_ = -(uint)(fStack_3d0 <= fVar172) & local_338._8_4_;
              local_338._12_4_ = -(uint)(fStack_3cc <= fVar172) & local_338._12_4_;
              bVar64 = bVar64 | bVar75 & 1;
              uVar69 = (undefined4)((ulong)lVar62 >> 0x20);
              iVar59 = movmskps((int)lVar62,local_338);
            } while (iVar59 != 0);
          }
          fVar172 = ray->tfar;
          auVar206._0_4_ =
               local_468._0_4_ & local_2f8._0_4_ &
               -(uint)(local_528 + (float)local_118._0_4_ <= fVar172);
          auVar206._4_4_ =
               local_468._4_4_ & local_2f8._4_4_ &
               -(uint)(fStack_524 + (float)local_118._4_4_ <= fVar172);
          auVar206._8_4_ =
               (uint)fStack_460 & local_2f8._8_4_ & -(uint)(fStack_520 + fStack_110 <= fVar172);
          auVar206._12_4_ =
               (uint)fStack_45c & local_2f8._12_4_ & -(uint)(fStack_51c + fStack_10c <= fVar172);
          auVar167._0_4_ =
               local_3f8._0_4_ & local_408._0_4_ &
               -(uint)(local_528 + (float)local_248._0_4_ <= fVar172);
          auVar167._4_4_ =
               local_3f8._4_4_ & local_408._4_4_ &
               -(uint)(fStack_524 + (float)local_248._4_4_ <= fVar172);
          auVar167._8_4_ =
               (uint)fStack_3f0 & (uint)fStack_400 & -(uint)(fStack_520 + fStack_240 <= fVar172);
          auVar167._12_4_ =
               (uint)fStack_3ec & (uint)fStack_3fc & -(uint)(fStack_51c + fStack_23c <= fVar172);
          iVar59 = movmskps(iVar59,auVar167 | auVar206);
          lVar62 = CONCAT44(uVar69,iVar59);
          if (iVar59 != 0) {
            lVar62 = (long)pRVar66 * 0x30;
            *(undefined1 (*) [16])(local_f8 + (long)pRVar66 * 0xc) = auVar167 | auVar206;
            auVar121._0_4_ = local_118._0_4_ & auVar206._0_4_;
            auVar121._4_4_ = local_118._4_4_ & auVar206._4_4_;
            auVar121._8_4_ = (uint)fStack_110 & auVar206._8_4_;
            auVar121._12_4_ = (uint)fStack_10c & auVar206._12_4_;
            auVar207._0_4_ = ~auVar206._0_4_ & local_248._0_4_;
            auVar207._4_4_ = ~auVar206._4_4_ & local_248._4_4_;
            auVar207._8_4_ = ~auVar206._8_4_ & (uint)fStack_240;
            auVar207._12_4_ = ~auVar206._12_4_ & (uint)fStack_23c;
            *(undefined1 (*) [16])(afStack_e8 + (long)pRVar66 * 0xc) = auVar207 | auVar121;
            *(undefined8 *)(local_d8 + (long)pRVar66 * 0xc) = local_2c8;
            fVar172 = (float)((int)local_4a0 + 1);
            pRVar63 = (RTCIntersectArguments *)(ulong)(uint)fVar172;
            local_d8[(long)pRVar66 * 0xc + 2] = fVar172;
            pRVar66 = (RTCIntersectArguments *)(ulong)((int)pRVar66 + 1);
          }
        }
      }
    }
    fVar172 = ray->tfar;
    pRVar67 = pRVar66;
    do {
      if ((int)pRVar67 == 0) {
        if (bVar64 != 0) {
          return local_5e9;
        }
        fVar172 = ray->tfar;
        auVar150._4_4_ = -(uint)(fStack_224 <= fVar172);
        auVar150._0_4_ = -(uint)(local_228 <= fVar172);
        auVar150._8_4_ = -(uint)(fStack_220 <= fVar172);
        auVar150._12_4_ = -(uint)(fStack_21c <= fVar172);
        uVar77 = movmskps((int)pRVar63,auVar150);
        uVar77 = (uint)local_280 - 1 & (uint)local_280 & uVar77;
        local_5e9 = uVar77 != 0;
        if (!local_5e9) {
          return local_5e9;
        }
        goto LAB_00bfcbc3;
      }
      pRVar63 = (RTCIntersectArguments *)(ulong)((int)pRVar67 - 1);
      local_498.valid._0_4_ =
           -(uint)(local_528 + afStack_e8[(long)pRVar63 * 0xc] <= fVar172) &
           local_f8[(long)pRVar63 * 0xc];
      local_498.valid._4_4_ =
           -(uint)(fStack_524 + afStack_e8[(long)pRVar63 * 0xc + 1] <= fVar172) &
           local_f8[(long)pRVar63 * 0xc + 1];
      local_498.geometryUserPtr._0_4_ =
           -(uint)(fStack_520 + afStack_e8[(long)pRVar63 * 0xc + 2] <= fVar172) &
           local_f8[(long)pRVar63 * 0xc + 2];
      local_498.geometryUserPtr._4_4_ =
           -(uint)(fStack_51c + afStack_e8[(long)pRVar63 * 0xc + 3] <= fVar172) &
           (uint)afStack_e8[(long)pRVar63 * 0xc + -1];
      iVar59 = movmskps((int)lVar62,(undefined1  [16])local_498._0_16_);
      lVar62 = CONCAT44((int)((ulong)lVar62 >> 0x20),iVar59);
      pRVar66 = pRVar63;
      if (iVar59 != 0) {
        auVar168._0_4_ = (uint)afStack_e8[(long)pRVar63 * 0xc] & (uint)local_498.valid;
        auVar168._4_4_ = (uint)afStack_e8[(long)pRVar63 * 0xc + 1] & local_498.valid._4_4_;
        auVar168._8_4_ = (uint)afStack_e8[(long)pRVar63 * 0xc + 2] & (uint)local_498.geometryUserPtr
        ;
        auVar168._12_4_ =
             (uint)afStack_e8[(long)pRVar63 * 0xc + 3] & local_498.geometryUserPtr._4_4_;
        auVar192._0_8_ =
             CONCAT44(~local_498.valid._4_4_,~(uint)local_498.valid) & 0x7f8000007f800000;
        auVar192._8_4_ = ~(uint)local_498.geometryUserPtr & 0x7f800000;
        auVar192._12_4_ = ~local_498.geometryUserPtr._4_4_ & 0x7f800000;
        auVar192 = auVar192 | auVar168;
        auVar208._4_4_ = auVar192._0_4_;
        auVar208._0_4_ = auVar192._4_4_;
        auVar208._8_4_ = auVar192._12_4_;
        auVar208._12_4_ = auVar192._8_4_;
        auVar85 = minps(auVar208,auVar192);
        auVar169._0_8_ = auVar85._8_8_;
        auVar169._8_4_ = auVar85._0_4_;
        auVar169._12_4_ = auVar85._4_4_;
        auVar85 = minps(auVar169,auVar85);
        auVar170._0_8_ =
             CONCAT44(-(uint)(auVar85._4_4_ == auVar192._4_4_) & local_498.valid._4_4_,
                      -(uint)(auVar85._0_4_ == auVar192._0_4_) & (uint)local_498.valid);
        auVar170._8_4_ = -(uint)(auVar85._8_4_ == auVar192._8_4_) & (uint)local_498.geometryUserPtr;
        auVar170._12_4_ =
             -(uint)(auVar85._12_4_ == auVar192._12_4_) & local_498.geometryUserPtr._4_4_;
        iVar68 = movmskps((int)lVar70,auVar170);
        auVar149 = (undefined1  [16])local_498._0_16_;
        if (iVar68 != 0) {
          auVar149._8_4_ = auVar170._8_4_;
          auVar149._0_8_ = auVar170._0_8_;
          auVar149._12_4_ = auVar170._12_4_;
        }
        fVar82 = local_d8[(long)pRVar63 * 0xc];
        fVar83 = local_d8[(long)pRVar63 * 0xc + 1];
        uVar69 = movmskps(iVar68,auVar149);
        uVar65 = CONCAT44((int)((ulong)lVar70 >> 0x20),uVar69);
        lVar70 = 0;
        if (uVar65 != 0) {
          for (; (uVar65 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
          }
        }
        *(undefined4 *)((long)&local_498.valid + lVar70 * 4) = 0;
        iVar68 = movmskps((int)pRVar71,(undefined1  [16])local_498._0_16_);
        pRVar71 = (RTCFilterFunctionNArguments *)(ulong)(uint)local_d8[(long)pRVar63 * 0xc + 2];
        if (iVar68 == 0) {
          pRVar67 = pRVar63;
        }
        *(undefined1 (*) [16])(local_f8 + (long)pRVar63 * 0xc) = (undefined1  [16])local_498._0_16_;
        fVar83 = fVar83 - fVar82;
        local_438._0_4_ = fVar83 * 0.0 + fVar82;
        local_438._4_4_ = fVar83 * 0.33333334 + fVar82;
        local_438._8_4_ = fVar83 * 0.6666667 + fVar82;
        fStack_42c = fVar83 * 1.0 + fVar82;
        local_2c8 = *(undefined8 *)(local_438 + lVar70 * 4);
        uStack_2c0 = 0;
        pRVar66 = pRVar67;
        local_4a0 = pRVar71;
      }
      pRVar67 = pRVar66;
    } while ((char)iVar59 == '\0');
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }